

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu6502.h
# Opt level: O3

cpu_state cpu_execute(cpu_state state)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  byte bVar15;
  long lVar16;
  byte bVar17;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  uint uVar36;
  ulong uVar37;
  byte bVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  bool bVar42;
  cpu_state cVar43;
  uint uVar18;
  uint uVar29;
  uint uVar30;
  uint uVar35;
  
  uVar24 = state._8_8_;
  uVar25 = state._0_8_;
  if (state.rw_mode != '\x02' &&
      ((undefined1  [16])state & (undefined1  [16])0x100) == (undefined1  [16])0x0) {
    uVar22 = uVar24 | 0x200;
    goto LAB_0010835c;
  }
  uVar37 = uVar25 >> 0x10;
  uVar32 = uVar25 >> 0x20;
  uVar10 = uVar25 >> 0x28;
  uVar31 = uVar25 >> 0x30;
  uVar36 = state._9_4_;
  uVar11 = (uVar24 >> 8 & 0xffffffff) >> 4;
  uVar22 = (ulong)((uVar36 & 0xed |
                   (uint)((uVar10 & 4) == 0 & (byte)((uVar24 >> 8 & 0xffffffff) >> 2) & 0x3f) << 4)
                  << 8);
  uVar23 = uVar24 & 0xffffffffffff00ff;
  uVar19 = (uVar36 & 0xed) >> 5;
  bVar15 = (byte)uVar19 & 1;
  uVar33 = uVar22 | 0x2000;
  if ((uVar19 & 1) != 0) {
    uVar33 = uVar22;
  }
  if (((undefined1  [16])state & (undefined1  [16])0x800) == (undefined1  [16])0x0) {
    uVar33 = uVar22;
  }
  uVar22 = uVar23 | uVar33;
  uVar14 = uVar22;
  if (6 < (byte)state.cycle) goto switchD_0010631e_caseD_2;
  bVar38 = state._9_1_ >> 1;
  uVar19 = state._0_4_;
  uVar26 = uVar19 + 1 & 0xffff;
  uVar41 = uVar26 >> 8;
  uVar40 = state._4_4_;
  uVar9 = uVar40 >> 8;
  uVar21 = (uint)uVar22;
  uVar2 = state.address;
  uVar28 = (uint)uVar2;
  uVar34 = state._2_4_;
  uVar29 = (uint)uVar2;
  uVar12 = (uint)(uVar23 >> 0x20);
  uVar39 = (uint)uVar33;
  uVar35 = uVar40 >> 8;
  uVar27 = uVar40 >> 8;
  cVar7 = (char)(uVar23 >> 0x18);
  uVar18 = (uint)(uVar23 >> 0x10);
  bVar17 = (byte)(uVar23 >> 0x20);
  uVar30 = (uint)(uVar23 >> 0x18);
  uVar20 = state._12_4_;
  bVar4 = state.address._1_1_;
  uVar3 = state._8_4_;
  uVar5 = state._10_4_;
  uVar6 = state._11_4_;
  uVar1 = (ushort)(uVar23 >> 0x30);
  switch(uVar25 & 0xff) {
  case 1:
    uVar14 = uVar24 & 0xffffffffffff0000 | uVar33;
    switch(uVar41) {
    case 0:
      uVar19 = uVar19 >> 8;
LAB_0010850f:
      uVar22 = (ulong)(uVar19 & 0xff0000) + (uVar24 & 0xffffffffff000000 | uVar33) + 2;
      uVar25 = uVar25 & 0xff00ffff0000 | uVar25 + 0xff00000000 & 0xff00000000 |
               (uVar32 & 0xff) << 0x30 | (ulong)uVar26 | 0x100000000000000;
      goto LAB_0010835c;
    case 1:
    case 3:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x21:
    case 0x23:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x41:
    case 0x43:
    case 0x54:
    case 0x55:
    case 0x56:
    case 0x57:
    case 0x61:
    case 99:
    case 0x74:
    case 0x75:
    case 0x76:
    case 0x77:
    case 0x81:
    case 0x83:
    case 0xa1:
    case 0xa3:
    case 0xb4:
    case 0xb5:
    case 0xc1:
    case 0xc3:
    case 0xd4:
    case 0xd5:
    case 0xd6:
    case 0xd7:
    case 0xe1:
    case 0xe3:
    case 0xf4:
    case 0xf5:
    case 0xf6:
    case 0xf7:
      uVar20 = uVar20 >> 8;
      goto LAB_00106887;
    case 4:
    case 5:
    case 6:
    case 7:
    case 0x11:
    case 0x13:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x31:
    case 0x33:
    case 0x44:
    case 0x45:
    case 0x46:
    case 0x47:
    case 0x51:
    case 0x53:
    case 100:
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x71:
    case 0x73:
    case 0x91:
    case 0x93:
    case 0xa4:
    case 0xa5:
    case 0xa6:
    case 0xa7:
    case 0xb1:
    case 0xb3:
    case 0xc4:
    case 0xc5:
    case 0xc6:
    case 199:
    case 0xd1:
    case 0xd3:
    case 0xe4:
    case 0xe5:
    case 0xe6:
    case 0xe7:
    case 0xf1:
    case 0xf3:
      uVar22 = uVar14 | 1;
      goto LAB_00106856;
    case 8:
    case 0x48:
      goto switchD_00106286_caseD_3;
    case 9:
switchD_00106286_caseD_19:
      uVar12 = uVar5 & 0xffff | uVar12;
      goto LAB_00106f73;
    case 0xb:
    case 0x2b:
      uVar12 = uVar5 & 0xffff & uVar12;
      uVar40 = uVar12 & 0xff;
      uVar14 = uVar24 & 0xffffff00ffff0000 | uVar33 | (ulong)uVar40 << 0x20;
      uVar12 = uVar12 & 0x80;
      uVar19 = uVar12 >> 7 | uVar9 & 0x5c;
LAB_00108c9c:
      uVar10 = (ulong)(uVar19 + (uint)(uVar40 == 0) * 2 + uVar12 + 0x20);
      break;
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x19:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x2c:
    case 0x2d:
    case 0x2e:
    case 0x2f:
    case 0x39:
    case 0x3b:
    case 0x3c:
    case 0x3d:
    case 0x3e:
    case 0x3f:
    case 0x4c:
    case 0x4d:
    case 0x4e:
    case 0x4f:
    case 0x59:
    case 0x5b:
    case 0x5c:
    case 0x5d:
    case 0x5e:
    case 0x5f:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x6f:
    case 0x79:
    case 0x7b:
    case 0x7c:
    case 0x7d:
    case 0x7e:
    case 0x7f:
    case 0x8c:
    case 0x8d:
    case 0x8e:
    case 0x8f:
    case 0x99:
    case 0x9b:
    case 0x9c:
    case 0x9d:
    case 0x9e:
    case 0x9f:
    case 0xac:
    case 0xad:
    case 0xae:
    case 0xaf:
    case 0xb9:
    case 0xbb:
    case 0xbc:
    case 0xbd:
    case 0xbe:
    case 0xbf:
    case 0xcc:
    case 0xcd:
    case 0xce:
    case 0xcf:
    case 0xd9:
    case 0xdb:
    case 0xdc:
    case 0xdd:
    case 0xde:
    case 0xdf:
    case 0xec:
    case 0xed:
    case 0xee:
    case 0xef:
    case 0xf9:
    case 0xfb:
    case 0xfc:
    case 0xfd:
    case 0xfe:
    case 0xff:
      uVar14 = (uVar24 & 0xffffffff00ff0000 | uVar33) + (ulong)((uVar3 & 0xff0000) << 8) + 1;
      goto LAB_0010637b;
    case 0x10:
      if ((char)state.P < '\0') break;
      goto LAB_001086b8;
    case 0x20:
      uVar14 = uVar24 & 0xffffffff00ff0000 | uVar33 | (ulong)((uVar3 & 0xff0000) << 8);
      goto switchD_00106286_caseD_3;
    case 0x28:
    case 0x40:
    case 0x60:
    case 0x68:
      uVar22 = uVar14 | 1;
      uVar24 = (ulong)(uVar40 + 1 & 0xff);
      uVar25 = (ulong)(uVar19 & 0xffff0000) |
               uVar24 << 0x20 | uVar25 & 0xff0000000000 | uVar24 << 0x30;
      goto LAB_00108cf7;
    case 0x29:
switchD_00106286_caseD_39:
      uVar12 = uVar5 & 0xffff & uVar12;
      goto LAB_00106f73;
    case 0x30:
      if ((char)state.P < '\0') goto LAB_001086b8;
      break;
    case 0x49:
switchD_00106286_caseD_59:
      uVar12 = uVar5 & 0xffff ^ uVar12;
LAB_00106f73:
      uVar25 = 0xffffff00ffffff00;
LAB_00107173:
      uVar10 = (ulong)((uVar12 & 0x80 | uVar9 & 0x5d) + (uint)((uVar12 & 0xff) == 0) * 2 + 0x20);
      uVar14 = uVar25 & uVar22 | (ulong)(uVar12 & 0xff) << 0x20;
      break;
    case 0x4b:
      uVar12 = uVar5 & 0xffff & uVar12;
      uVar19 = uVar12 >> 1 & 0x7f;
      uVar10 = (ulong)((uVar12 & 1 | uVar9 & 0x5c) + (uint)(uVar19 == 0) * 2 + 0x20);
      uVar14 = (ulong)uVar19 << 0x20 | uVar24 & 0xffffff00ffff0000 | uVar33;
      break;
    case 0x50:
      if ((uVar10 & 0x40) == 0) goto LAB_001086b8;
      break;
    case 0x69:
switchD_00106286_caseD_79:
      uVar36 = (uVar35 & 1) + (uVar5 & 0xff) + (uVar12 & 0xff);
      uVar19 = (uVar12 ^ uVar36) & (uVar5 & 0xffff ^ uVar36);
      uVar25 = 0xffffff00ffffff00;
LAB_00107065:
      uVar10 = (ulong)(uVar36 & 0x80 | uVar9 & 0x1c | uVar36 >> 8 | (uint)((uVar36 & 0xff) == 0) * 2
                       | uVar19 >> 1 & 0x40 | 0x20);
      uVar14 = uVar25 & uVar22 | (ulong)(uVar36 & 0xff) << 0x20;
      break;
    case 0x6b:
      uVar12 = uVar5 & 0xffff & uVar12;
      uVar19 = uVar9 * 0x80 & 0xff | uVar12 >> 1 & 0x7f;
      uVar10 = (ulong)(uVar9 * 0x80 +
                       (uVar12 >> 7 & 1 | uVar27 & 0x1c | (uVar12 >> 1 ^ uVar12) & 0x40) +
                       (uint)(uVar19 == 0) * 2 + 0x20);
      uVar14 = (ulong)uVar19 << 0x20 | uVar24 & 0xffffff00ffff0000 | uVar33;
      break;
    case 0x70:
      if ((uVar10 & 0x40) != 0) goto LAB_001086b8;
      break;
    case 0x84:
      goto LAB_00108625;
    case 0x85:
      uVar12 = uVar18;
      goto LAB_00108625;
    case 0x86:
      uVar12 = uVar30;
LAB_00108625:
      uVar12 = uVar12 & 0xff0000;
LAB_0010862b:
      uVar22 = (uVar24 & 0xffffffffff000000 | uVar33) + (ulong)uVar12 + 2;
LAB_00106856:
      uVar24 = (ulong)(uVar21 & 0xff0000) << 0x20;
      uVar11 = 0xffffffff0000;
LAB_0010686a:
      uVar25 = uVar25 & uVar11;
LAB_0010686d:
      uVar25 = uVar26 | uVar25 | uVar24;
      goto LAB_0010835c;
    case 0x87:
      uVar12 = (uVar12 >> 8 & uVar12 & 0xff) << 0x10;
      goto LAB_0010862b;
    case 0x8b:
      uVar12 = uVar5 & 0xffff & uVar12 >> 8 & uVar12;
      uVar19 = uVar12 & 0xff;
      uVar14 = uVar24 & 0xffffff00ffff0000 | uVar33 | (ulong)(byte)uVar12 << 0x20;
LAB_001084cb:
      uVar36 = uVar12 & 0x80 | uVar9 & 0x5d;
      goto LAB_001084da;
    case 0x90:
      uVar22 = uVar10 & 1;
      goto joined_r0x0010848c;
    case 0x94:
      uVar22 = (ulong)((uVar12 >> 8) + (uVar5 & 0xffff) & 0xff);
      goto LAB_001085e0;
    case 0x95:
      uVar22 = (ulong)((uVar12 >> 8) + (uVar5 & 0xffff) & 0xff);
      uVar12 = uVar18;
      goto LAB_001085e0;
    case 0x96:
      uVar22 = (ulong)((uint)uVar1 + (uVar5 & 0xffff) & 0xff);
      uVar12 = uVar30;
LAB_001085e0:
      uVar14 = (ulong)(uVar12 & 0xff0000) + (uVar24 & 0xffffffffff000000 | uVar33) + 2;
LAB_0010688d:
      uVar22 = uVar22 << 0x30;
      uVar24 = 0xffffffff0000;
LAB_0010689b:
      uVar25 = uVar25 & uVar24;
LAB_00106399:
      uVar25 = uVar25 | uVar22;
LAB_00106f5b:
      uVar11 = (ulong)uVar26;
      uVar22 = uVar14;
      goto LAB_00106f5d;
    case 0x97:
      uVar22 = (ulong)((uint)uVar1 + (uVar5 & 0xffff) & 0xff);
      uVar14 = (uVar24 & 0xffffffffff000000 | uVar33) +
               (ulong)((uVar12 >> 8 & uVar12 & 0xff) << 0x10) + 2;
      goto LAB_0010688d;
    case 0xa0:
switchD_00106551_caseD_bc:
      uVar24 = (ulong)(uVar3 & 0xff0000);
      uVar25 = uVar24 << 0x20;
      uVar14 = 0xff00ffffffffff00;
      goto LAB_00107736;
    case 0xa2:
switchD_00106551_caseD_be:
      uVar24 = (ulong)(uVar3 & 0xff0000);
      uVar25 = uVar24 << 0x18;
      uVar14 = 0xffff00ffffffff00;
      goto LAB_00107736;
    case 0xa9:
switchD_00106551_caseD_b9:
      uVar24 = (ulong)(uVar3 & 0xff0000);
      uVar25 = uVar24 << 0x10;
      uVar14 = 0xffffff00ffffff00;
LAB_00107736:
      uVar14 = uVar14 & uVar22;
LAB_00107739:
      uVar14 = uVar14 | uVar25;
LAB_0010773c:
      bVar42 = uVar24 == 0;
LAB_00107751:
      uVar10 = (ulong)(uVar21 >> 0x10 & 0x80) + (ulong)(uVar9 & 0x5d) + (ulong)bVar42 * 2 + 0x20;
      break;
    case 0xab:
switchD_00106551_caseD_bf:
      uVar25 = 0xffff0000ffffff00;
LAB_00107617:
      uVar24 = (ulong)(uVar3 & 0xff0000);
      uVar25 = uVar25 & uVar22 | uVar24 << 0x10;
      uVar14 = uVar24 << 0x18;
      goto LAB_00107739;
    case 0xb0:
      uVar22 = uVar10 & 1;
      goto joined_r0x0010857e;
    case 0xb6:
    case 0xb7:
      uVar20 = (uint)uVar1;
LAB_00106887:
      uVar22 = (ulong)(uVar20 + (uVar5 & 0xffff) & 0xff);
      uVar14 = uVar14 | 1;
      goto LAB_0010688d;
    case 0xc0:
      uVar12 = (uint)uVar1;
      goto LAB_00106c04;
    case 0xc9:
switchD_00106551_caseD_d9:
      goto LAB_00106c04;
    case 0xcb:
      uVar12 = uVar12 >> 8 & uVar12;
      uVar36 = uVar12 - (uVar5 & 0xffff);
      uVar19 = uVar36 & 0xff;
      uVar14 = uVar24 & 0xffff00ffffff0000 | uVar33 | (ulong)uVar19 << 0x28;
      uVar36 = uVar36 & 0x80 | uVar9 & 0x5c | (uint)((uVar5 & 0xff) <= (uVar12 & 0xff));
LAB_001084da:
      uVar10 = (ulong)(uVar36 + (uint)(uVar19 == 0) * 2 + 0x20);
      break;
    case 0xd0:
      uVar22 = uVar10 & 2;
joined_r0x0010848c:
      if (uVar22 != 0) break;
LAB_001086b8:
      uVar22 = (ulong)((int)(char)state.data + uVar34);
      uVar24 = uVar24 & 0xffffffffffff0000 | (ulong)(uVar39 & 0xed00);
      if ((uVar39 >> 0xc & 1) == 0) {
        uVar24 = uVar14;
      }
      if ((uVar11 & 1) == 0) {
        uVar14 = uVar24;
      }
      goto LAB_0010688d;
    case 0xe0:
      uVar12 = uVar12 >> 8;
LAB_00106c04:
      uVar19 = (uVar12 & 0xff) - (uVar21 >> 0x10 & 0xff);
      cVar7 = (char)uVar19;
      uVar36 = uVar19 & 0x80 | uVar9 & 0x5c | uVar19 >> 8 & 1;
LAB_00106c2f:
      uVar14 = uVar24 & 0xffffffffffff0000 | uVar33;
      uVar36 = uVar36 + (uint)(cVar7 == '\0') * 2;
LAB_00107131:
      uVar10 = (ulong)(uVar36 ^ 0x21);
      break;
    case 0xe9:
    case 0xeb:
switchD_00106551_caseD_f9:
      uVar19 = ~(uVar3 & 0xffff00ff) >> 0x10;
      uVar36 = (uVar35 & 1) + (uVar12 & 0xff) + (uVar19 | 0xffffff00);
      uVar19 = (uVar12 ^ uVar36) & (uVar19 ^ uVar36);
      uVar25 = 0xffffff00ffffff00;
LAB_00107110:
      uVar14 = uVar25 & uVar22 | (ulong)(uVar36 & 0xff) << 0x20;
      uVar36 = (uVar36 & 0x80 | uVar9 & 0x1c | uVar36 >> 8 & 1) + (uint)((uVar36 & 0xff) == 0) * 2;
LAB_0010712f:
      uVar36 = uVar36 | uVar19 >> 1 & 0x40;
      goto LAB_00107131;
    case 0xf0:
      uVar22 = uVar10 & 2;
joined_r0x0010857e:
      if (uVar22 == 0) break;
      goto LAB_001086b8;
    }
switchD_001063e5_caseD_5c:
    iVar8 = (int)uVar37;
    if (bVar15 == 0 && (uVar11 & 1) == 0) {
      uVar22 = uVar14 & 0xffffffff00ffff00 | 1;
      iVar8 = iVar8 + 1;
      uVar31 = uVar37 & 0xffffffff;
    }
    else {
      uVar22 = uVar14 & 0xffffffff0000ff00 | 0xfe000000;
    }
    uVar25 = (uVar32 & 0xff) << 0x20 | (uVar10 & 0xff) << 0x28 | uVar31 << 0x30;
    uVar26 = iVar8 << 0x10;
LAB_001081de:
    uVar25 = uVar26 | uVar25;
    goto LAB_0010835c;
  case 2:
    switch(uVar41) {
    case 0:
      uVar22 = uVar24 & 0xffffffffff0000ff | uVar33 | (ulong)(uVar19 & 0xff0000);
      uVar25 = uVar25 & 0xff00ffff0000 | uVar25 + 0xff00000000 & 0xff00000000 |
               (uVar32 & 0xff) << 0x30 | (ulong)uVar26 | 0x100000000000000;
      goto LAB_0010835c;
    case 1:
    case 3:
    case 0x11:
    case 0x13:
    case 0x21:
    case 0x23:
    case 0x31:
    case 0x33:
    case 0x41:
    case 0x43:
    case 0x51:
    case 0x53:
    case 0x61:
    case 99:
    case 0x71:
    case 0x73:
    case 0x81:
    case 0x83:
    case 0x91:
    case 0x93:
    case 0xa1:
    case 0xa3:
    case 0xb1:
    case 0xb3:
    case 0xc1:
    case 0xc3:
    case 0xd1:
    case 0xd3:
    case 0xe1:
    case 0xe3:
    case 0xf1:
    case 0xf3:
      uVar14 = (uVar24 & 0xffffffff00ff0000 | uVar33) + (ulong)((uVar21 & 0xff0000) << 8) + 1;
      uVar22 = uVar25 + 0x1000000000000 & 0xff000000000000;
      goto LAB_00106572;
    case 5:
switchD_0010631e_caseD_d:
      uVar12 = uVar5 & 0xffff | uVar12;
      goto LAB_00107157;
    case 6:
    case 7:
    case 0x16:
    case 0x17:
    case 0x26:
    case 0x27:
    case 0x36:
    case 0x37:
    case 0x46:
    case 0x47:
    case 0x56:
    case 0x57:
    case 0x66:
    case 0x67:
    case 0x76:
    case 0x77:
    case 0x97:
    case 0xc6:
    case 199:
    case 0xd6:
    case 0xd7:
    case 0xe6:
    case 0xe7:
    case 0xf6:
    case 0xf7:
switchD_0010631e_caseD_e:
      uVar22 = uVar24 & 0xffffffffffff0000 | uVar33 | 2;
      goto LAB_00106a7a;
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x2c:
    case 0x2d:
    case 0x2e:
    case 0x2f:
    case 0x4d:
    case 0x4e:
    case 0x4f:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x6f:
    case 0xac:
    case 0xad:
    case 0xae:
    case 0xaf:
    case 0xcc:
    case 0xcd:
    case 0xce:
    case 0xcf:
    case 0xec:
    case 0xed:
    case 0xee:
    case 0xef:
switchD_0010631e_caseD_1:
      uVar14 = (uVar24 & 0xffffffffffff0000 | uVar33) + 1;
      uVar25 = uVar25 & 0xffffffff0000 | (ulong)(uVar21 >> 0x18 | uVar36 & 0xff00) << 0x30;
      goto LAB_00106f5b;
    case 0x10:
    case 0x30:
    case 0x50:
    case 0x70:
    case 0x90:
    case 0xb0:
    case 0xd0:
    case 0xf0:
      uVar37 = uVar31;
      if (((uVar34 ^ uVar29) & 0xff00) != 0) {
        uVar25 = (ulong)uVar26 | (ulong)uVar2 << 0x10 | uVar25 & 0xffffffff00000000;
        goto LAB_0010835c;
      }
      goto switchD_001063e5_caseD_5c;
    case 0x14:
    case 0x15:
    case 0x34:
    case 0x35:
    case 0x54:
    case 0x55:
    case 0x60:
    case 0x74:
    case 0x75:
    case 0x94:
    case 0x95:
    case 0x96:
    case 0xd4:
    case 0xd5:
    case 0xf4:
    case 0xf5:
      uVar22 = uVar24 & 0xffffffffffff0000 | uVar33;
LAB_00106a7a:
      uVar25 = uVar25 & 0xffffffffffff0000 | (ulong)uVar26;
      goto LAB_0010835c;
    case 0x19:
    case 0x1b:
    case 0x39:
    case 0x3b:
    case 0x59:
    case 0x5b:
    case 0x79:
    case 0x7b:
    case 0x99:
    case 0x9b:
    case 0x9e:
    case 0x9f:
    case 0xb9:
    case 0xbb:
    case 0xbe:
    case 0xbf:
    case 0xd9:
    case 0xdb:
    case 0xf9:
    case 0xfb:
switchD_0010631e_caseD_11:
      uVar20 = (uint)state._14_2_;
      goto LAB_001068c6;
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x3c:
    case 0x3d:
    case 0x3e:
    case 0x3f:
    case 0x5c:
    case 0x5d:
    case 0x5e:
    case 0x5f:
    case 0x7c:
    case 0x7d:
    case 0x7e:
    case 0x7f:
    case 0x9c:
    case 0x9d:
    case 0xbc:
    case 0xbd:
    case 0xdc:
    case 0xdd:
    case 0xde:
    case 0xdf:
    case 0xfc:
    case 0xfd:
    case 0xfe:
    case 0xff:
      uVar20 = uVar20 >> 8;
LAB_001068c6:
      uVar14 = (uVar24 & 0xffffffff00ff0000 | uVar33) +
               (ulong)(((uVar20 & 0xff) + (uVar30 & 0xff) & 0x100) << 0x10) + 1;
      uVar25 = uVar25 & 0xffffffff0000 | (ulong)(uVar30 + uVar20 & 0xff | uVar36 & 0xff00) << 0x30;
      goto LAB_00106f5b;
    case 0x20:
      uVar22 = (ulong)(uVar19 >> 8);
LAB_0010810c:
      uVar19 = (uint)uVar22;
      goto LAB_0010850f;
    case 0x24:
switchD_0010631e_caseD_2c:
      uVar10 = (ulong)(((uint)((uVar24 & 0xffff00ff) >> 0x10) & 0xc0 | uVar9 & 0x1d) +
                       (uint)(((byte)((uVar24 & 0xffff00ff) >> 0x10) & bVar17) == 0) * 2 + 0x20);
      break;
    case 0x25:
switchD_0010631e_caseD_2d:
      uVar12 = uVar5 & 0xffff & uVar12;
      goto LAB_00107157;
    case 0x28:
      uVar22 = uVar24 & 0xffffffffffff0000 | uVar33;
      uVar25 = (ulong)uVar26 | uVar25 & 0xffff00ffffff0000 | (ulong)(uVar21 & 0xcf0000) << 0x18;
      goto LAB_00108354;
    case 0x40:
      uVar25 = (ulong)(uVar40 + 1 & 0xff);
      uVar11 = (ulong)uVar26 |
               (ulong)(uVar19 & 0xffff0000) |
               uVar25 << 0x20 | (ulong)(uVar21 & 0xcf0000) << 0x18 | uVar25 << 0x30;
      uVar25 = 0x100200000000000;
      uVar22 = (uVar24 & 0xffffffffffff0000 | uVar33) + 1;
      goto LAB_00106f5d;
    case 0x45:
switchD_0010631e_caseD_4d:
      uVar12 = uVar5 & 0xffff ^ uVar12;
LAB_00107157:
      uVar25 = 0xffffff00ffffffff;
      goto LAB_00107173;
    case 0x4c:
      uVar37 = (ulong)(uVar6 & 0xff | uVar36 & 0xff00);
      break;
    case 0x65:
switchD_0010631e_caseD_6d:
      uVar36 = (uVar27 & 1) + (uVar5 & 0xff) + (uVar12 & 0xff);
      uVar19 = (uVar12 ^ uVar36) & (uVar5 & 0xffff ^ uVar36);
      uVar25 = 0xffffff00ffffffff;
      goto LAB_00107065;
    case 0x68:
switchD_001062ba_caseD_68:
      uVar11 = (ulong)(uVar3 & 0xff0000);
      uVar37 = uVar11 << 0x10;
      uVar24 = 0xffffff00ffffff00;
      goto LAB_00108319;
    case 0x8c:
      uVar22 = (ulong)(uVar6 & 0xff | uVar36 & 0xff00);
      goto LAB_0010815e;
    case 0x8d:
switchD_0010631e_caseD_81:
      uVar22 = (ulong)(uVar6 & 0xff | uVar36 & 0xff00);
      uVar20 = uVar18;
      goto LAB_0010815e;
    case 0x8e:
      uVar22 = (ulong)(uVar6 & 0xff | uVar36 & 0xff00);
      uVar20 = uVar30;
LAB_0010815e:
      uVar14 = (uVar24 & 0xffffffffff000000 | uVar33) + (ulong)(uVar20 & 0xff0000) + 2;
LAB_00106564:
      uVar22 = uVar22 << 0x30;
LAB_00106572:
      uVar25 = uVar25 & 0xffffffff0000 | uVar22;
      goto LAB_00106f5b;
    case 0x8f:
switchD_0010631e_caseD_83:
      uVar22 = (ulong)(uVar6 & 0xff | uVar36 & 0xff00);
      uVar14 = (ulong)((uVar12 >> 8 & uVar12 & 0xff) << 0x10) +
               (uVar24 & 0xffffffffff000000 | uVar33) + 2;
      goto LAB_00106564;
    case 0xa4:
switchD_0010631e_caseD_ac:
      uVar24 = (ulong)(uVar3 & 0xff0000);
      uVar25 = uVar24 << 0x20;
      uVar14 = 0xff00ffffffffff00;
      goto LAB_00107736;
    case 0xa5:
switchD_0010631e_caseD_ad:
      uVar24 = (ulong)(uVar3 & 0xff0000);
      uVar25 = uVar24 << 0x10;
      uVar14 = 0xffffff00ffffff00;
      goto LAB_00107736;
    case 0xa6:
switchD_0010631e_caseD_ae:
      uVar24 = (ulong)(uVar3 & 0xff0000);
      uVar25 = uVar24 << 0x18;
      uVar14 = 0xffff00ffffffffff;
      goto LAB_00107736;
    case 0xa7:
switchD_0010631e_caseD_af:
      uVar25 = 0xffff0000ffffffff;
      goto LAB_00107617;
    case 0xb4:
      uVar11 = (ulong)(uVar3 & 0xff0000);
      uVar37 = uVar11 << 0x20;
      uVar24 = 0xff00ffffffffff00;
      goto LAB_00108312;
    case 0xb5:
      uVar11 = (ulong)(uVar3 & 0xff0000);
      uVar37 = uVar11 << 0x10;
      uVar24 = 0xffffff00ffffff00;
LAB_00108312:
      uVar24 = uVar24 | 0xff;
LAB_00108319:
      uVar24 = uVar24 & uVar22;
LAB_0010831c:
      uVar24 = uVar24 | uVar37;
LAB_0010831f:
      uVar9 = uVar9 & 0x5d;
      uVar19 = ((uint)(uVar22 >> 0x10) & 0x80) + (uint)(uVar11 == 0) * 2;
      goto LAB_00108339;
    case 0xb6:
      uVar24 = uVar24 & 0xffff00ffffff00ff | uVar33 | (ulong)(uVar3 & 0xff0000) << 0x18;
      uVar19 = (uVar21 >> 0x10 & 0x80) + (uint)((ulong)(uVar3 & 0xff0000) == 0) * 2;
      goto LAB_00108c04;
    case 0xb7:
      uVar24 = 0xffff0000ffffffff;
LAB_001082bd:
      uVar11 = (ulong)(uVar3 & 0xff0000);
      uVar37 = uVar24 & uVar22 | uVar11 << 0x10;
      uVar24 = uVar11 << 0x18;
      goto LAB_0010831c;
    case 0xc4:
switchD_0010631e_caseD_cc:
      uVar12 = (uint)uVar1;
      goto LAB_0010764d;
    case 0xc5:
switchD_0010631e_caseD_cd:
      goto LAB_0010764d;
    case 0xe4:
switchD_0010631e_caseD_ec:
      uVar12 = uVar12 >> 8;
LAB_0010764d:
      uVar19 = (uVar12 & 0xff) - (uVar5 & 0xff);
      cVar7 = (char)uVar19;
      uVar19 = uVar19 & 0x80 | uVar9 & 0x5c | uVar19 >> 8 & 1;
LAB_0010767a:
      uVar10 = (ulong)(uVar19 + (uint)(cVar7 == '\0') * 2 ^ 0x21);
      break;
    case 0xe5:
switchD_0010631e_caseD_ed:
      uVar19 = ~(uVar3 & 0xffff00ff) >> 0x10;
      uVar36 = (uVar27 & 1) + (uVar12 & 0xff) + (uVar19 | 0xffffff00);
      uVar19 = (uVar12 ^ uVar36) & (uVar19 ^ uVar36);
      uVar25 = 0xffffff00ffffffff;
      goto LAB_00107110;
    }
switchD_0010631e_caseD_2:
    goto switchD_001063e5_caseD_5c;
  case 3:
    switch(uVar41) {
    case 0:
      uVar37 = uVar24 & 0xffffffffff0000ff | uVar33;
      uVar22 = (ulong)((uVar9 & 0xef) << 0x10) | 0x100000;
      uVar11 = (ulong)(uint)((int)(uVar10 & 0xff) << 0x10);
      if ((uVar3 & 0xff000000) == 0xfc000000) {
        uVar11 = uVar22;
      }
      if (uVar21 < 0x1000000) {
        uVar11 = uVar22;
      }
      uVar22 = uVar11 | uVar37;
      if ((uVar39 >> 8 & 0x20) == 0) {
        if (cVar7 == '\0' || (uVar33 & 0x1000) != 0) {
          uVar22 = uVar11 | uVar24 & 0xffffffff000000ff | uVar33 | 0xfe000000;
        }
      }
      else {
        uVar22 = (uVar11 | uVar37 & 0xffffffff00ffd7ff) + 0xfa000000;
      }
      uVar25 = (ulong)(uVar19 & 0xffff0000) |
               uVar25 + 0xff00000000 & 0xff00000000 |
               (uVar10 & 0xff) << 0x28 | (uVar32 & 0xff) << 0x30;
      goto LAB_00108cf7;
    case 1:
    case 3:
    case 0x21:
    case 0x23:
    case 0x41:
    case 0x43:
    case 0x61:
    case 99:
    case 0xa1:
    case 0xa3:
    case 0xc1:
    case 0xc3:
    case 0xe1:
    case 0xe3:
      goto switchD_0010631e_caseD_1;
    default:
      goto switchD_0010631e_caseD_2;
    case 6:
    case 0x16:
      uVar36 = (uint)((uVar24 & 0xffff00ff) >> 0x17) & 1 | uVar9 & 0x5c;
LAB_00107350:
      uVar19 = uVar21 * 2 & 0xfe0000;
      lVar13 = (uVar24 & 0xffffffffff000000 | uVar33) + (ulong)uVar19;
      uVar21 = uVar21 >> 0xf;
      bVar42 = uVar19 == 0;
      goto LAB_001069fb;
    case 7:
    case 0x17:
switchD_001065a3_caseD_1b:
      uVar36 = (uint)((uVar24 & 0xffff00ff) >> 0x17) & 1 | uVar9 & 0x5c;
      uVar22 = (ulong)(uVar21 * 2 & 0xfe0000);
      uVar24 = uVar24 & 0xffffffffff000000 | uVar33 | uVar22 << 0x10;
      uVar22 = uVar22 + uVar24 + 2;
      uVar19 = ((uint)(uVar24 >> 0x20) & 0x80) + (uint)((char)(uVar24 >> 0x20) == '\0') * 2;
      goto LAB_00106a03;
    case 0xd:
    case 0x15:
      goto switchD_0010631e_caseD_d;
    case 0xe:
    case 0xf:
    case 0x2e:
    case 0x2f:
    case 0x4e:
    case 0x4f:
    case 0x6e:
    case 0x6f:
    case 0xce:
    case 0xcf:
    case 0xee:
    case 0xef:
      goto switchD_0010631e_caseD_e;
    case 0x11:
    case 0x13:
    case 0x31:
    case 0x33:
    case 0x51:
    case 0x53:
    case 0x71:
    case 0x73:
    case 0x91:
    case 0x93:
    case 0xb1:
    case 0xb3:
    case 0xd1:
    case 0xd3:
    case 0xf1:
    case 0xf3:
      goto switchD_0010631e_caseD_11;
    case 0x19:
    case 0x1d:
      if (cVar7 == '\0') {
        uVar25 = uVar22 << 0x10 | uVar22;
LAB_0010754c:
        uVar24 = 0xffffff0000ffffff;
LAB_00107b6f:
        uVar10 = (ulong)((uint)(uVar25 >> 0x20) & 0x80 | uVar9 & 0x5d) +
                 (ulong)((uVar25 & 0xff00000000) == 0) * 2 + 0x20;
        uVar14 = uVar24 & uVar22 | uVar25 & 0xff00000000;
        goto switchD_001063e5_caseD_5c;
      }
      break;
    case 0x1b:
    case 0x1e:
    case 0x1f:
    case 0x3b:
    case 0x3e:
    case 0x3f:
    case 0x5b:
    case 0x5e:
    case 0x5f:
    case 0x7b:
    case 0x7e:
    case 0x7f:
    case 0xdb:
    case 0xde:
    case 0xdf:
    case 0xfb:
    case 0xfe:
    case 0xff:
      uVar14 = (uVar24 & 0xffffffffffff0000 | uVar33) + 1;
LAB_00106558:
      uVar22 = (ulong)(uVar28 + (uVar21 >> 0x10 & 0xff00));
      goto LAB_00106564;
    case 0x1c:
    case 0x3c:
    case 0x5c:
    case 0x7c:
    case 0xdc:
    case 0xfc:
      if (cVar7 != '\0') break;
      goto switchD_0010631e_caseD_2;
    case 0x20:
      uVar22 = uVar25;
      goto LAB_0010810c;
    case 0x26:
    case 0x36:
      uVar36 = (uint)(uVar22 >> 0xf);
      uVar19 = uVar36 & 0xfe | uVar27 & 1;
      uVar22 = (uVar24 & 0xffffffffff000000 | uVar33) + (ulong)(uVar19 << 0x10) + 2;
      uVar24 = (ulong)((uVar36 & 0x80) + (uint)(uVar19 == 0) * 2 |
                      (uint)((uVar24 & 0xffff00ff) >> 0x17) & 1 | uVar9 & 0x5c);
      goto LAB_00106a06;
    case 0x27:
    case 0x37:
switchD_0010699c_caseD_3b:
      uVar36 = (uint)((uVar24 & 0xffff00ff) >> 0x17) & 1 | uVar9 & 0x5c;
      uVar19 = (uint)((uVar24 & 0xffff00ff) >> 0xf) & 0xfe | uVar35 & 1;
      uVar22 = ((ulong)uVar19 << 0x20) - 0xff00ff0100 & uVar22;
      lVar13 = (uVar19 << 0x10) + uVar22;
      uVar21 = (uint)(uVar22 >> 0x20);
      bVar42 = (char)(uVar22 >> 0x20) == '\0';
LAB_001069fb:
      uVar22 = lVar13 + 2;
      uVar19 = (uVar21 & 0x80) + (uint)bVar42 * 2;
      goto LAB_00106a03;
    case 0x2c:
      goto switchD_0010631e_caseD_2c;
    case 0x2d:
    case 0x35:
      goto switchD_0010631e_caseD_2d;
    case 0x39:
    case 0x3d:
      if (cVar7 == '\0') {
        uVar25 = 0xffffff0000ffffff;
LAB_00107aa5:
        uVar12 = uVar5 & 0xffff & uVar12;
        uVar14 = uVar25 & uVar22 | (ulong)uVar12 << 0x20;
        uVar19 = uVar12;
        goto LAB_001084cb;
      }
      break;
    case 0x40:
    case 0x60:
      uVar11 = (ulong)(uVar40 + 1 & 0xff);
      uVar22 = (uVar24 & 0xffffffff00ff0000 | uVar33) + (ulong)((uVar21 & 0xff0000) << 8) + 1;
      uVar25 = (ulong)(uVar19 & 0xffff0000) |
               uVar11 << 0x20 | uVar25 & 0xff0000000000 | uVar11 << 0x30;
LAB_00108cf7:
      uVar25 = uVar26 | uVar25 | 0x100000000000000;
      goto LAB_0010835c;
    case 0x46:
    case 0x56:
      uVar36 = uVar5 & 1 | uVar9 & 0x5c;
      uVar19 = uVar21 >> 1 & 0x7f0000;
      bVar42 = uVar19 == 0;
      uVar22 = (uVar24 & 0xffffffffff000000 | uVar33) + 2 + (ulong)uVar19;
      goto LAB_001088b4;
    case 0x47:
    case 0x57:
switchD_0010631e_caseD_47:
      uVar36 = uVar5 & 1 | uVar9 & 0x5c;
      uVar19 = (uint)((uVar24 & 0xffff00ff) >> 1);
LAB_0010674c:
      uVar11 = (ulong)(uVar19 & 0x7f0000) << 0x10;
      uVar22 = (ulong)(uVar19 & 0x7f0000) +
               (uVar11 ^ uVar24 & 0xff00000000 | uVar24 & 0xffffff00ff000000 | uVar33) + 2;
      uVar19 = (uVar12 & 0x80) + (uint)((uVar24 & 0xff00000000) == uVar11) * 2;
LAB_00106a03:
      uVar24 = (ulong)(uVar19 | uVar36);
LAB_00106a06:
      uVar25 = uVar25 & 0xffff00ffffff0000 | uVar24 << 0x28;
      goto LAB_0010834f;
    case 0x4d:
    case 0x55:
      goto switchD_0010631e_caseD_4d;
    case 0x59:
    case 0x5d:
      if (cVar7 == '\0') {
        uVar25 = uVar22 << 0x10 ^ uVar22;
        goto LAB_0010754c;
      }
      break;
    case 0x66:
    case 0x76:
      uVar36 = (uVar9 & 1) << 7;
      uVar19 = uVar21 >> 0x11 & 0x7f | uVar36;
      lVar13 = (uVar24 & 0xffffffffff000000 | uVar33) + (ulong)(uVar19 << 0x10);
      uVar19 = (uVar5 & 1 | uVar27 & 0x5c) + (uint)(uVar19 == 0) * 2;
LAB_001072c0:
      uVar24 = lVar13 + 2;
      uVar19 = uVar19 | uVar36;
      goto LAB_0010833b;
    case 0x67:
    case 0x77:
switchD_0010631e_caseD_67:
      uVar22 = uVar24 & 0xffffff00ff000000 | uVar33;
      uVar19 = (uVar35 & 1) << 7 | (uint)((uVar24 & 0xffff00ff) >> 0x11) & 0x7f;
      uVar33 = (ulong)(uVar19 << 0x10);
LAB_00106683:
      uVar19 = (uVar12 & 0xff) + uVar19 + (uint)((uVar21 >> 0x10 & 1) != 0);
      lVar16 = (ulong)(uVar19 & 0xff) << 0x20;
      lVar13 = lVar16 + (uVar33 | uVar22);
      uVar22 = lVar16 + (uVar33 | uVar22) + 2;
      uVar24 = (ulong)(uVar19 >> 8 | uVar9 & 0x1c |
                       ((uVar12 ^ uVar19) & (uVar35 << 7 ^ uVar19)) >> 1 & 0x40 |
                       (uint)((ulong)lVar13 >> 0x20) & 0x80 |
                       (uint)((char)((ulong)lVar13 >> 0x20) == '\0') * 2 | 0x20) << 0x28;
      uVar11 = 0xffff00ffffff0000;
      goto LAB_0010686a;
    case 0x6c:
      uVar22 = (ulong)(uVar29 + 1 & 0xff | uVar29 & 0xff00);
      uVar14 = (uVar24 & 0xffffffff00ff0000 | uVar33) + (ulong)((uVar21 & 0xff0000) << 8) + 1;
      goto LAB_00106564;
    case 0x6d:
    case 0x75:
      goto switchD_0010631e_caseD_6d;
    case 0x79:
    case 0x7d:
      if (cVar7 == '\0') {
        uVar36 = (uVar27 & 1) + (uVar5 & 0xffff) + (uVar12 & 0xff);
        uVar19 = (uVar12 ^ uVar36) & (uVar5 & 0xffff ^ uVar36);
        uVar25 = 0xffffff0000ffffff;
LAB_00108c83:
        uVar40 = uVar36 & 0xff;
        uVar12 = uVar19 >> 1 & 0x40;
        uVar14 = uVar25 & uVar22 | (ulong)uVar40 << 0x20;
        uVar19 = uVar36 & 0x80 | uVar9 & 0x1c | uVar36 >> 8 & 1;
        goto LAB_00108c9c;
      }
      break;
    case 0x81:
      goto switchD_0010631e_caseD_81;
    case 0x83:
      goto switchD_0010631e_caseD_83;
    case 0x99:
    case 0x9d:
      uVar22 = (ulong)(uVar28 + (uVar18 & 0xff00));
      uVar20 = uVar18;
      goto LAB_0010815e;
    case 0x9b:
      uVar12 = uVar12 >> 8 & uVar12;
      uVar19 = (-(uint)((bVar38 & 1) != 0) | bVar4 + 1) & uVar12;
      uVar22 = (ulong)(uVar19 << 8 | uVar28 & 0xff);
      if (cVar7 == '\0') {
        uVar22 = uVar31;
      }
      uVar14 = (uVar24 & 0xffffffffff000000 | uVar33) + (ulong)((uVar19 & 0xff) << 0x10) + 2;
      uVar22 = (ulong)(uVar12 & 0xff) << 0x20 | uVar25 & 0xff0000000000 | uVar22 << 0x30;
      goto LAB_00106394;
    case 0x9c:
      iVar8 = 0x30;
      goto LAB_00108041;
    case 0x9e:
      iVar8 = 0x28;
LAB_00108041:
      uVar19 = (uint)(uVar22 >> iVar8) & (-(uint)((bVar38 & 1) != 0) | bVar4 + 1);
      uVar22 = (uVar24 & 0xffffffffff000000 | uVar33) + (ulong)((uVar19 & 0xff) << 0x10) + 2;
      uVar24 = (ulong)(uVar19 << 8 | uVar28 & 0xff);
      if (cVar7 == '\0') {
        uVar24 = uVar31;
      }
      uVar25 = uVar25 & 0xffffffff0000 | uVar24 << 0x30;
      goto LAB_001081de;
    case 0x9f:
      uVar19 = uVar12;
      if ((bVar38 & 1) == 0) {
        uVar19 = uVar12 & bVar4 + 1;
      }
      uVar19 = uVar12 >> 8 & uVar19;
      uVar14 = uVar24 & 0xffffffffff000000 | uVar33 | (ulong)((uVar19 & 0xff) << 0x10) | 2;
LAB_00107dac:
      uVar22 = (ulong)(uVar19 << 8 | uVar28 & 0xff);
      if (cVar7 == '\0') {
        uVar22 = uVar31;
      }
      goto LAB_0010688d;
    case 0xac:
      goto switchD_0010631e_caseD_ac;
    case 0xad:
      goto switchD_0010631e_caseD_ad;
    case 0xae:
      goto switchD_0010631e_caseD_ae;
    case 0xaf:
      goto switchD_0010631e_caseD_af;
    case 0xb9:
    case 0xbd:
      if (cVar7 == '\0') {
        uVar24 = (ulong)(uVar3 & 0xff0000);
        uVar25 = uVar24 << 0x10;
        uVar14 = 0xffffff0000ffff00;
        goto LAB_00107736;
      }
      break;
    case 0xbb:
      if (cVar7 == '\0') {
        uVar40 = uVar40 & uVar5 & 0xffff;
        uVar32 = (ulong)uVar40;
        uVar10 = (ulong)((uVar40 & 0x80 | uVar9 & 0x5d) + (uint)(uVar40 == 0) * 2 + 0x20);
        uVar14 = (uVar32 & 0xff) << 0x20 | uVar32 << 0x28 | uVar24 & 0xffff000000ff00ff | uVar33;
        goto switchD_001063e5_caseD_5c;
      }
      lVar13 = (uVar25 & 0xffffffff0000) + (uVar25 & 0xffff000000000000);
LAB_00108015:
      uVar22 = (uVar24 & 0xffffffffffff0000 | uVar33) + 1;
      uVar25 = (ulong)uVar26 + lVar13 + 0x100000000000000;
      goto LAB_0010835c;
    case 0xbc:
      if (cVar7 != '\0') {
        uVar25 = (ulong)uVar26 + (uVar25 & 0xffffffffffff0000);
        goto LAB_00107e24;
      }
      uVar14 = uVar24 & 0xff00ffff00ff00ff | uVar33 | (uVar24 & 0xff0000) << 0x20;
      bVar42 = uVar22 << 0x20 < 0x1000000000000;
      goto LAB_00107751;
    case 0xbe:
      if (cVar7 == '\0') {
        uVar24 = (ulong)(uVar3 & 0xff0000);
        uVar25 = uVar24 << 0x18;
        uVar14 = 0xffff00ff00ffffff;
        goto LAB_00107736;
      }
      break;
    case 0xbf:
      if (cVar7 != '\0') {
        lVar13 = (uVar25 & 0xffffffff0000) + (uVar25 & 0xffff000000000000);
        goto LAB_00108015;
      }
      uVar25 = 0xffff000000ffffff;
LAB_00108d38:
      uVar24 = (ulong)(uVar3 & 0xff0000);
      uVar14 = uVar24 << 0x18 | uVar25 & uVar22 | uVar24 << 0x10;
      goto LAB_0010773c;
    case 0xc6:
    case 0xd6:
      uVar22 = uVar22 + 0xff0000;
      uVar11 = uVar22 & 0xff0000;
      goto LAB_0010726c;
    case 199:
    case 0xd7:
switchD_0010631e_caseD_c7:
      lVar13 = (uVar24 & 0xffffffffff000000 | uVar33) + (uVar22 + 0xff0000 & 0xff0000);
      uVar19 = (uVar12 & 0xff) - ((uint)(uVar22 + 0xff0000 >> 0x10) & 0xff);
LAB_001067ee:
      uVar14 = lVar13 + 2;
      uVar19 = (uVar19 & 0x80 | uVar9 & 0x5c | uVar19 >> 8 & 1) + (uint)((char)uVar19 == '\0') * 2;
      goto LAB_00106b57;
    case 0xcc:
      goto switchD_0010631e_caseD_cc;
    case 0xcd:
    case 0xd5:
      goto switchD_0010631e_caseD_cd;
    case 0xd9:
    case 0xdd:
      if (cVar7 != '\0') break;
      uVar19 = (uVar20 & 0xff) - (uVar5 & 0xffff);
      cVar7 = (char)uVar19;
      uVar19 = uVar19 & 0x80 | uVar9 & 0x5c | uVar19 >> 8 & 1;
      goto LAB_0010767a;
    case 0xe6:
    case 0xf6:
      uVar22 = uVar22 + 0x10000;
      uVar11 = (ulong)((uint)uVar22 & 0xff0000);
LAB_0010726c:
      uVar24 = (uVar24 & 0xffffffffff000000 | uVar33) + uVar11 + 2;
      goto LAB_0010831f;
    case 0xe7:
    case 0xf7:
switchD_0010631e_caseD_e7:
      uVar22 = uVar24 & 0xffffff00ff000000 | uVar33;
      uVar33 = (ulong)(uVar21 + 0x10000 & 0xff0000);
LAB_00106add:
      uVar36 = ~(uVar21 + 0x10000) >> 0x10;
      uVar19 = (uVar35 & 1) + (uVar12 & 0xff) + (uVar36 | 0xffffff00);
      uVar14 = (uVar33 | uVar22) + ((ulong)(uVar19 & 0xff) << 0x20) + 2;
      uVar19 = (uVar19 & 0x80 | uVar9 & 0x1c | uVar19 >> 8 & 1) + (uint)((uVar19 & 0xff) == 0) * 2 |
               ((uVar12 ^ uVar19) & (uVar36 ^ uVar19)) >> 1 & 0x40;
LAB_00106b57:
      uVar19 = uVar19 ^ 0x21;
      uVar22 = uVar14;
LAB_00106b5a:
      uVar25 = (ulong)uVar26 | uVar25 & 0xffff00ffffff0000 | (ulong)uVar19 << 0x28;
      goto LAB_0010835c;
    case 0xec:
      goto switchD_0010631e_caseD_ec;
    case 0xed:
    case 0xf5:
      goto switchD_0010631e_caseD_ed;
    case 0xf9:
    case 0xfd:
      if (cVar7 == '\0') {
        uVar36 = (uVar27 & 1) + ~(uVar5 & 0xffff) + (uVar12 & 0xff);
        uVar19 = (uVar12 ^ uVar36) & (~(uVar5 & 0xffff) ^ uVar36);
        uVar25 = 0xffffff0000ffffff;
LAB_001078bd:
        uVar14 = uVar25 & uVar22 | (ulong)(uVar36 & 0xff) << 0x20;
        uVar36 = (uVar36 & 0x80 | uVar9 & 0x1c | uVar36 >> 8 & 1) + (uint)((uVar36 & 0xff) == 0) * 2
        ;
        goto LAB_0010712f;
      }
    }
    uVar25 = (ulong)uVar26 | uVar25 & 0xffffffffffff0000;
LAB_00107e24:
    uVar22 = (uVar24 & 0xffffffffffff0000 | uVar33) + 1;
    uVar25 = uVar25 + 0x100000000000000;
    goto LAB_0010835c;
  case 4:
    uVar14 = uVar24 & 0xffffffffffff0000 | uVar33;
    if (0xa0 < uVar41) {
      switch(uVar41) {
      case 0xb1:
        if (cVar7 == '\0') {
          uVar24 = (ulong)(uVar3 & 0xff0000);
          uVar25 = uVar24 << 0x10;
          uVar14 = 0xffffff0000ffff00;
          goto LAB_00107736;
        }
        goto LAB_00107ca7;
      case 0xb2:
      case 0xb4:
      case 0xb5:
      case 0xb6:
      case 0xb7:
      case 0xb8:
      case 0xba:
      case 0xc0:
      case 0xc2:
      case 0xc4:
      case 0xc5:
      case 0xc6:
      case 199:
      case 200:
      case 0xc9:
      case 0xca:
      case 0xcb:
      case 0xcc:
      case 0xcd:
      case 0xd0:
      case 0xd2:
      case 0xd4:
      case 0xd5:
      case 0xd8:
      case 0xda:
      case 0xdc:
      case 0xe0:
      case 0xe2:
      case 0xe4:
      case 0xe5:
      case 0xe6:
      case 0xe7:
      case 0xe8:
      case 0xe9:
      case 0xea:
      case 0xeb:
      case 0xec:
      case 0xed:
      case 0xf0:
      case 0xf2:
      case 0xf4:
      case 0xf5:
      case 0xf8:
      case 0xfa:
      case 0xfc:
        break;
      case 0xb3:
        if (cVar7 != '\0') {
          uVar22 = uVar14 | 1;
          uVar25 = (ulong)uVar26 + (uVar25 & 0xffffffff0000) + (uVar25 & 0xffff000000000000) +
                   0x100000000000000;
          goto LAB_0010835c;
        }
        uVar25 = 0xffff000000ffff00;
        goto LAB_00108d38;
      case 0xb9:
      case 0xbd:
        goto switchD_00106551_caseD_b9;
      case 0xbb:
        uVar40 = uVar40 & uVar5 & 0xffff;
        uVar32 = (ulong)uVar40;
        uVar25 = uVar32 & 0xff;
        uVar10 = (ulong)((uVar40 & 0x80 | uVar9 & 0x5d) + (uint)((int)uVar25 == 0) * 2 + 0x20);
        uVar14 = uVar25 << 0x28 | uVar24 & 0xffff0000ffff0000 | uVar33 | uVar25 << 0x20;
        break;
      case 0xbc:
        goto switchD_00106551_caseD_bc;
      case 0xbe:
        goto switchD_00106551_caseD_be;
      case 0xbf:
        goto switchD_00106551_caseD_bf;
      case 0xc1:
        uVar19 = (uVar12 & 0xff) - (uVar21 >> 0x10 & 0xff);
        uVar19 = (uVar19 & 0x80 | uVar9 & 0x5c | uVar19 >> 8 & 1) + (uint)((char)uVar19 == '\0') * 2
        ;
        goto LAB_00106b57;
      case 0xc3:
      case 0xd6:
      case 0xd7:
      case 0xe3:
      case 0xf6:
      case 0xf7:
        goto switchD_00106286_caseD_3;
      case 0xce:
switchD_001067b7_caseD_de:
        uVar11 = uVar22 + 0xff0000 & 0xff0000;
        uVar24 = (uVar24 & 0xffffffffff000000 | uVar33) + uVar11 + 2;
        uVar19 = (uint)(uVar22 + 0xff0000 >> 0x10) & 0xffff;
        goto LAB_00106d1d;
      case 0xcf:
switchD_001067b7_caseD_db:
        lVar13 = (uVar22 + 0xff0000 & 0xff0000) + (uVar24 & 0xffffffffff000000 | uVar33);
        uVar19 = (uVar12 & 0xff) - ((uint)(uVar22 + 0xff0000 >> 0x10) & 0xff);
        goto LAB_001067ee;
      case 0xd1:
        if (cVar7 != '\0') goto LAB_00107ca7;
        uVar19 = (uVar20 & 0xff) - (uVar21 >> 0x10);
        cVar7 = (char)uVar19;
        uVar36 = uVar19 & 0x80 | uVar9 & 0x5c | uVar19 >> 8 & 1;
        goto LAB_00106c2f;
      case 0xd3:
      case 0xf3:
        goto switchD_00106286_caseD_13;
      case 0xd9:
      case 0xdd:
        goto switchD_00106551_caseD_d9;
      case 0xdb:
      case 0xde:
      case 0xdf:
      case 0xfb:
      case 0xfe:
      case 0xff:
        goto switchD_001063e5_caseD_63;
      case 0xe1:
        uVar36 = ~(uVar3 & 0xffff00ff) >> 0x10;
        uVar19 = (uVar27 & 1) + (uVar12 & 0xff) + (uVar36 | 0xffffff00);
        uVar14 = uVar24 & 0xffffff00ffff0000 | uVar33 | (ulong)(uVar19 & 0xff) << 0x20;
        uVar19 = (uVar19 & 0x80 | uVar9 & 0x1c | uVar19 >> 8 & 1) + (uint)((uVar19 & 0xff) == 0) * 2
                 | ((uVar12 ^ uVar19) & (uVar36 ^ uVar19)) >> 1 & 0x40;
        goto LAB_00106b57;
      case 0xee:
switchD_00106551_caseD_ee:
        uVar11 = (ulong)(uVar21 + 0x10000 & 0xff0000);
        uVar24 = (uVar24 & 0xffffffffff000000 | uVar33) + uVar11 + 2;
        uVar19 = uVar21 + 0x10000 >> 0x10;
        goto LAB_00106ded;
      case 0xef:
        goto switchD_00106551_caseD_ef;
      case 0xf1:
        if (cVar7 == '\0') {
          uVar36 = (uVar27 & 1) + ~(uVar5 & 0xffff) + (uVar12 & 0xff);
          uVar19 = (uVar12 ^ uVar36) & (~(uVar5 & 0xffff) ^ uVar36);
          uVar25 = 0xffffff0000ffff00;
          goto LAB_001078bd;
        }
        goto LAB_00107ca7;
      case 0xf9:
      case 0xfd:
        goto switchD_00106551_caseD_f9;
      default:
        if (uVar41 == 0xa1) goto switchD_001062ba_caseD_68;
        if (uVar41 == 0xa3) {
          uVar24 = 0xffff0000ffffff00;
          goto LAB_001082bd;
        }
      }
      goto switchD_001063e5_caseD_5c;
    }
    switch(uVar41) {
    case 0:
      uVar11 = (ulong)uVar26 | uVar25 & 0xdbffffff0000 | (ulong)(uVar21 & 0xff000000) << 0x18;
      uVar25 = 0xff00240000000000;
      uVar22 = uVar14 | 1;
      goto LAB_00106f5d;
    case 1:
      uVar12 = uVar5 & 0xffff | uVar12;
      goto LAB_00107c4c;
    default:
      goto switchD_001063e5_caseD_5c;
    case 3:
    case 0x16:
    case 0x17:
    case 0x23:
    case 0x36:
    case 0x37:
    case 0x43:
    case 0x56:
    case 0x57:
    case 99:
    case 0x76:
    case 0x77:
    case 0x81:
    case 0x83:
      goto switchD_00106286_caseD_3;
    case 0xe:
switchD_001065a3_caseD_1e:
      uVar36 = (uint)((uVar24 & 0xffff00ff) >> 0x17) & 1 | uVar9 & 0x5c;
      goto LAB_00107350;
    case 0xf:
      goto switchD_001065a3_caseD_1b;
    case 0x11:
      if (cVar7 == '\0') {
        uVar25 = uVar22 << 0x10 | uVar22;
LAB_00107b58:
        uVar24 = 0xffffff0000ffff00;
        goto LAB_00107b6f;
      }
      break;
    case 0x13:
    case 0x33:
    case 0x53:
    case 0x73:
switchD_00106286_caseD_13:
      uVar14 = uVar14 | 1;
      goto LAB_00106558;
    case 0x19:
    case 0x1d:
      goto switchD_00106286_caseD_19;
    case 0x1b:
    case 0x1e:
    case 0x1f:
    case 0x3b:
    case 0x3e:
    case 0x3f:
    case 0x5b:
    case 0x5e:
    case 0x5f:
    case 0x7b:
    case 0x7e:
    case 0x7f:
      goto switchD_001063e5_caseD_63;
    case 0x20:
      goto switchD_00106286_caseD_20;
    case 0x21:
      uVar12 = uVar5 & 0xffff & uVar12;
      goto LAB_00107c4c;
    case 0x2e:
switchD_0010699c_caseD_3e:
      uVar36 = (uint)((uVar24 & 0xffff00ff) >> 0x17) & 1 | uVar9 & 0x5c;
      uVar40 = (uint)(uVar22 >> 0xf);
      uVar19 = uVar40 & 0xfe | uVar35 & 1;
      uVar22 = (ulong)(uVar19 << 0x10) + (uVar24 & 0xffffffffff000000 | uVar33) + 2;
      uVar19 = (uVar40 & 0x80) + (uint)(uVar19 == 0) * 2;
      goto LAB_00106a03;
    case 0x2f:
      goto switchD_0010699c_caseD_3b;
    case 0x31:
      if (cVar7 == '\0') {
        uVar25 = 0xffffff0000ffff00;
        goto LAB_00107aa5;
      }
      break;
    case 0x39:
    case 0x3d:
      goto switchD_00106286_caseD_39;
    case 0x40:
      uVar25 = uVar25 & 0xffffffff00000000;
      uVar24 = (ulong)((uVar21 >> 0x18 | uVar36 & 0xff00) << 0x10);
      uVar22 = uVar14;
      goto LAB_0010686d;
    case 0x41:
      uVar12 = uVar5 & 0xffff ^ uVar12;
LAB_00107c4c:
      uVar14 = uVar24 & 0xffffff00ffff0000 | uVar33 | (ulong)(uVar12 & 0xff) << 0x20;
      uVar22 = (ulong)((uVar12 & 0x80 | uVar9 & 0x5d) + (uint)((uVar12 & 0xff) == 0) * 2 + 0x20) <<
               0x28;
      uVar24 = 0xffff00ffffff0000;
      goto LAB_0010689b;
    case 0x4e:
switchD_001063e5_caseD_5e:
      uVar11 = (uVar24 & 0xffff00ff) >> 1;
      uVar22 = (uVar24 & 0xffffffffff000000 | uVar33) + (ulong)((uint)uVar11 & 0x7f0000) + 2;
      uVar24 = (ulong)((uVar5 & 1 | uVar9 & 0x5c) + (uint)((uVar11 & 0x7f0000) == 0) * 2);
      goto LAB_00106a06;
    case 0x4f:
switchD_001063e5_caseD_5b:
      uVar36 = uVar5 & 1 | uVar9 & 0x5c;
      uVar19 = (uint)((uVar24 & 0xffff00ff) >> 1);
      goto LAB_0010674c;
    case 0x51:
      if (cVar7 == '\0') {
        uVar25 = uVar22 << 0x10 ^ uVar22;
        goto LAB_00107b58;
      }
      break;
    case 0x59:
    case 0x5d:
      goto switchD_00106286_caseD_59;
    case 0x60:
      uVar25 = uVar25 & 0xffffffff00000000;
      uVar24 = (ulong)((uVar21 >> 0x18 | uVar36 & 0xff00) * 0x10000 + 0x10000);
      uVar22 = uVar14;
      goto LAB_0010686d;
    case 0x61:
      uVar19 = (uVar27 & 1) + (uVar5 & 0xff) + (uVar12 & 0xff);
      uVar22 = uVar24 & 0xffffff00ffff0000 | uVar33 | (ulong)(uVar19 & 0xff) << 0x20;
      uVar25 = (ulong)uVar26 | uVar25 & 0xffff00ffffff0000 |
               (ulong)(uVar19 & 0x80 | uVar9 & 0x1c | uVar19 >> 8 | (uint)((uVar19 & 0xff) == 0) * 2
                       | ((uVar12 ^ uVar19) & (uVar5 & 0xffff ^ uVar19)) >> 1 & 0x40 | 0x20) << 0x28
      ;
      goto LAB_0010835c;
    case 0x6c:
switchD_001065a3_caseD_20:
      uVar14 = uVar24 & 0xffffffffffff0000 | uVar33;
      uVar37 = (ulong)(uVar21 >> 0x18 | uVar36 & 0xff00);
      goto switchD_001063e5_caseD_5c;
    case 0x6e:
switchD_00106286_caseD_6e:
      uVar36 = (uVar9 & 1) << 7;
      uVar19 = (uint)((uVar24 & 0xffff00ff) >> 0x11) & 0x7f | uVar36;
      lVar13 = (ulong)(uVar19 << 0x10) + (uVar24 & 0xffffffffff000000 | uVar33);
      uVar19 = (uVar5 & 1 | uVar35 & 0x5c) + (uint)(uVar19 == 0) * 2;
      goto LAB_001072c0;
    case 0x6f:
      goto switchD_00106286_caseD_6f;
    case 0x71:
      if (cVar7 == '\0') {
        uVar36 = (uVar9 & 1) + (uVar5 & 0xffff) + (uVar12 & 0xff);
        uVar19 = (uVar12 ^ uVar36) & (uVar5 & 0xffff ^ uVar36);
        uVar25 = 0xffffff0000ffff00;
        goto LAB_00108c83;
      }
      break;
    case 0x79:
    case 0x7d:
      goto switchD_00106286_caseD_79;
    case 0x91:
      uVar22 = (ulong)(uVar28 + (uVar18 & 0xff00));
      uVar14 = (uVar24 & 0xffffffffff000000 | uVar33) + (ulong)(uVar18 & 0xff0000) + 2;
      goto LAB_00106564;
    case 0x93:
      uVar19 = uVar12;
      if ((bVar38 & 1) == 0) {
        uVar19 = uVar12 & bVar4 + 1;
      }
      uVar19 = uVar12 >> 8 & uVar19;
      uVar14 = (ulong)((uVar19 & 0xff) << 0x10) + (uVar24 & 0xffffffffff000000 | uVar33) + 2;
      goto LAB_00107dac;
    }
LAB_00107ca7:
    uVar22 = uVar14 | 1;
    uVar25 = ((ulong)uVar26 | uVar25 & 0xffffffffffff0000) + 0x100000000000000;
    goto LAB_0010835c;
  case 5:
    uVar14 = uVar24 & 0xffffffffffff0000 | uVar33;
    if (0x70 < uVar41) {
      if (uVar41 < 0xdb) {
        if (uVar41 < 0xb1) {
          if (0x7a < uVar41) {
            if (uVar41 != 0x7b) {
              if (uVar41 == 0x7e) goto switchD_00106286_caseD_6e;
              if (uVar41 != 0x7f) goto switchD_001063e5_caseD_5c;
            }
switchD_00106286_caseD_6f:
            uVar19 = (uVar35 & 1) << 7 | (uint)((uVar24 & 0xffff00ff) >> 0x11) & 0x7f;
            uVar22 = (ulong)(uVar19 << 0x10);
            uVar33 = uVar24 & 0xffffff00ff000000 | uVar33;
            goto LAB_00106683;
          }
          if (uVar41 == 0x71) goto switchD_00106286_caseD_79;
          if (uVar41 == 0x73) goto switchD_001063e5_caseD_63;
        }
        else {
          if (0xc2 < uVar41) {
            if (uVar41 != 0xc3) {
              if (uVar41 == 0xd1) goto switchD_00106551_caseD_d9;
              if (uVar41 != 0xd3) goto switchD_001063e5_caseD_5c;
            }
            goto switchD_001063e5_caseD_63;
          }
          if (uVar41 == 0xb1) goto switchD_00106551_caseD_b9;
          if (uVar41 == 0xb3) goto switchD_00106551_caseD_bf;
        }
      }
      else if (uVar41 < 0xf3) {
        switch(uVar41) {
        case 0xdb:
        case 0xdf:
          goto switchD_001067b7_caseD_db;
        case 0xdc:
        case 0xdd:
        case 0xe0:
        case 0xe1:
        case 0xe2:
          break;
        case 0xde:
          goto switchD_001067b7_caseD_de;
        case 0xe3:
          goto switchD_001063e5_caseD_63;
        default:
          if (uVar41 == 0xf1) goto switchD_00106551_caseD_f9;
        }
      }
      else if (uVar41 < 0xfe) {
        if (uVar41 == 0xf3) goto switchD_001063e5_caseD_63;
        if (uVar41 == 0xfb) {
switchD_00106551_caseD_ef:
          uVar22 = (ulong)(uVar21 + 0x10000 & 0xff0000);
          uVar33 = uVar24 & 0xffffff00ff000000 | uVar33;
          goto LAB_00106add;
        }
      }
      else {
        if (uVar41 == 0xfe) goto switchD_00106551_caseD_ee;
        if (uVar41 == 0xff) goto switchD_00106551_caseD_ef;
      }
      goto switchD_001063e5_caseD_5c;
    }
    if (uVar41 < 0x33) {
      if (uVar41 < 0x13) {
        if (uVar26 >> 8 == 0) {
          uVar22 = uVar14 | 1;
          uVar25 = (ulong)uVar26 +
                   (uVar25 & 0xffff00000000) + (uVar25 & 0xffff000000000000 | 0xffffffff0000) +
                   (ulong)(uVar21 & 0xff0000) + 0x10000;
          goto LAB_0010835c;
        }
        if (uVar41 == 3) goto switchD_001063e5_caseD_63;
        if (uVar41 == 0x11) {
          uVar12 = uVar5 & 0xffff | uVar12;
          goto LAB_00106f9b;
        }
      }
      else {
        switch(uVar41) {
        case 0x1b:
        case 0x1f:
          goto switchD_001065a3_caseD_1b;
        case 0x1c:
        case 0x1d:
        case 0x21:
        case 0x22:
          break;
        case 0x1e:
          goto switchD_001065a3_caseD_1e;
        case 0x20:
          goto switchD_001065a3_caseD_20;
        case 0x23:
          goto switchD_001063e5_caseD_63;
        default:
          if (uVar41 == 0x13) goto switchD_001063e5_caseD_63;
          if (uVar41 == 0x31) goto switchD_00106286_caseD_39;
        }
      }
    }
    else if (uVar41 < 0x51) {
      switch(uVar41) {
      case 0x3b:
      case 0x3f:
        goto switchD_0010699c_caseD_3b;
      case 0x3c:
      case 0x3d:
      case 0x40:
      case 0x41:
      case 0x42:
        break;
      case 0x3e:
        goto switchD_0010699c_caseD_3e;
      case 0x43:
switchD_001063e5_caseD_63:
        uVar14 = uVar24 & 0xffffffffffff0000 | uVar33 | 2;
        goto switchD_00106286_caseD_3;
      default:
        if (uVar41 == 0x33) goto switchD_001063e5_caseD_63;
      }
    }
    else {
      switch(uVar41) {
      case 0x5b:
      case 0x5f:
        goto switchD_001063e5_caseD_5b;
      case 0x5c:
      case 0x5d:
      case 0x60:
      case 0x61:
      case 0x62:
        break;
      case 0x5e:
        goto switchD_001063e5_caseD_5e;
      case 99:
        goto switchD_001063e5_caseD_63;
      default:
        if (uVar41 == 0x51) {
          uVar12 = uVar5 & 0xffff ^ uVar12;
LAB_00106f9b:
          uVar10 = (ulong)((uVar12 & 0x80 | uVar9 & 0x5d) + (uint)((uVar12 & 0xff) == 0) * 2 + 0x20)
          ;
          uVar14 = uVar24 & 0xffffff00ffff0000 | uVar33 | (ulong)(uVar12 & 0xff) << 0x20;
        }
        else if (uVar41 == 0x53) goto switchD_001063e5_caseD_63;
      }
    }
    goto switchD_001063e5_caseD_5c;
  case 6:
    if (uVar41 < 0x53) {
      if (uVar41 < 0x23) {
        if (uVar26 >> 8 == 0) {
          uVar37 = (ulong)(uVar34 | uVar36 & 0xff00);
          bVar15 = 0;
        }
        else if ((uVar41 == 3) || (uVar41 == 0x13)) goto switchD_001065a3_caseD_1b;
      }
      else {
        if ((uVar41 == 0x23) || (uVar41 == 0x33)) goto switchD_0010699c_caseD_3b;
        if (uVar41 == 0x43) goto switchD_0010631e_caseD_47;
      }
    }
    else if (uVar41 < 0xc3) {
      if (uVar41 == 0x53) goto switchD_0010631e_caseD_47;
      if ((uVar41 == 99) || (uVar41 == 0x73)) goto switchD_0010631e_caseD_67;
    }
    else if (uVar41 < 0xe3) {
      if ((uVar41 == 0xc3) || (uVar41 == 0xd3)) goto switchD_0010631e_caseD_c7;
    }
    else if ((uVar41 == 0xe3) || (uVar41 == 0xf3)) goto switchD_0010631e_caseD_e7;
    goto switchD_0010631e_caseD_2;
  }
  uVar26 = uVar36 & 0xff00 | uVar19 + 1 & 0xff;
  uVar14 = uVar24 & 0xffffffffffff0000 | uVar33;
  switch(uVar24 >> 0x10 & 0xff) {
  case 0:
    if (cVar7 == '\0') goto switchD_00106245_caseD_1;
  case 0x28:
  case 0x68:
switchD_00106286_caseD_20:
    uVar22 = uVar24 & 0xffffffffffff0000 | uVar33 | 1;
    uVar25 = (ulong)uVar26 | (ulong)(uVar34 << 0x10) | uVar25 & 0xffff00000000 | uVar37 << 0x30;
    goto LAB_0010835c;
  default:
switchD_00106245_caseD_1:
    uVar14 = uVar14 | 1;
LAB_0010637b:
    uVar22 = uVar25 & 0xffff00000000 | uVar37 << 0x30;
    uVar25 = (ulong)(uVar19 + 0x10000);
LAB_00106394:
    uVar25 = (ulong)((uint)uVar25 & 0xffff0000);
    goto LAB_00106399;
  case 2:
  case 0x12:
  case 0x22:
  case 0x32:
  case 0x42:
  case 0x52:
  case 0x62:
  case 0x72:
  case 0x92:
  case 0xb2:
  case 0xd2:
  case 0xf2:
    uVar11 = (ulong)uVar26;
    uVar25 = uVar25 & 0xffffffffffff0000;
    uVar22 = uVar14;
    break;
  case 8:
    uVar22 = (ulong)((uVar9 & 0xef) << 0x10) + (uVar24 & 0xffffffffff000000 | uVar33) + 0x100002;
    goto LAB_00108b68;
  case 10:
    uVar11 = uVar22 * 2 & 0xfe00000000;
    uVar22 = uVar24 & 0xffffff00ffff0000 | uVar33 | uVar11;
    uVar24 = (ulong)(((uint)(uVar24 >> 0x1f) & 0x80) + (uint)(uVar11 == 0) * 2 |
                    uVar12 >> 7 & 1 | uVar9 & 0x5c);
    goto LAB_00106a06;
  case 0x18:
    uVar24 = 0xffffdeffffff0000;
    goto LAB_00108bb0;
  case 0x1a:
  case 0x3a:
  case 0x5a:
  case 0x7a:
  case 0xda:
  case 0xea:
  case 0xfa:
    goto switchD_00106286_caseD_3;
  case 0x2a:
    uVar19 = (uVar12 & 0xff) * 2;
    uVar36 = uVar19 & 0xff | uVar27 & 1;
    uVar22 = uVar24 & 0xffffff00ffff0000 | uVar33 | (ulong)uVar36 << 0x20;
    uVar19 = ((uVar12 & 0xff) >> 7 | uVar9 & 0x5c | uVar19 & 0x80) + (uint)(uVar36 == 0) * 2 + 0x20;
    goto LAB_00106b5a;
  case 0x38:
    uVar11 = (ulong)uVar26 | uVar25 & 0xffffdeffffff0000;
    uVar25 = 0x210000000000;
    uVar22 = uVar14;
    break;
  case 0x48:
    uVar22 = (uVar24 & 0xffffffffff000000 | uVar33) + (ulong)(uVar18 & 0xff0000) + 2;
LAB_00108b68:
    uVar25 = uVar25 & 0xff00ffff0000 | uVar25 + 0xff00000000 & 0xff00000000 |
             (uVar32 & 0xff) << 0x30 | (ulong)uVar26 | 0x100000000000000;
    goto LAB_0010835c;
  case 0x4a:
    uVar36 = uVar12 & 1 | uVar9 & 0x5c;
    uVar11 = (uVar24 & 0xfe00000000) >> 1;
    uVar22 = uVar24 & 0xffffff00ffff0000 | uVar33 | uVar11;
    bVar42 = uVar11 == 0;
LAB_001088b4:
    uVar24 = (ulong)(uVar36 + (uint)bVar42 * 2);
    goto LAB_00106a06;
  case 0x58:
    uVar24 = 0xffffdbffffff0000;
    goto LAB_00108bb0;
  case 0x6a:
    uVar19 = uVar12 & 1 | uVar27 & 0x5c;
    uVar9 = (uVar9 & 1) << 7;
    uVar11 = (ulong)uVar9 + (ulong)(uVar12 >> 1 & 0x7f);
    uVar24 = uVar24 & 0xffffff00ffff0000 | uVar33 | uVar11 << 0x20;
    goto LAB_00106df4;
  case 0x78:
    uVar11 = (ulong)uVar26 | uVar25 & 0xffffdbffffff0000;
    uVar25 = 0x240000000000;
    uVar22 = uVar14;
    break;
  case 0x88:
    uVar11 = uVar22 + 0xff000000000000 & 0xff000000000000;
    uVar24 = uVar24 & 0xff00ffffffff0000 | uVar33 | uVar11;
    uVar19 = (uint)(ushort)(uVar22 + 0xff000000000000 >> 0x30);
LAB_00106d1d:
    uVar9 = uVar9 & 0x5d;
    uVar19 = (uVar19 & 0x80) + (uint)(uVar11 == 0) * 2;
    goto LAB_00108339;
  case 0x8a:
    uVar24 = uVar24 & 0xffffff00ffff0000 | uVar33 | (uVar24 & 0xff0000000000) >> 8;
    uVar20 = uVar20 >> 8;
    goto LAB_00108a36;
  case 0x98:
    uVar24 = uVar24 & 0xffffff00ffff0000 | uVar33 | (uVar24 & 0xff000000000000) >> 0x10;
    uVar20 = (uint)state._14_2_;
    goto LAB_00108a36;
  case 0x9a:
    uVar22 = (uVar24 & 0xff0000000000) >> 8;
    uVar24 = 0xffffff00ffff0000;
    goto LAB_0010689b;
  case 0xa8:
    uVar24 = uVar24 & 0xff00ffffffff0000 | uVar33 | (uVar24 & 0xff00000000) << 0x10;
LAB_00108a36:
    uVar9 = uVar9 & 0x5d;
    uVar19 = (uVar20 & 0x80) + (uint)((char)uVar20 == '\0') * 2;
LAB_00108339:
    uVar19 = uVar19 | uVar9;
LAB_0010833b:
    uVar22 = (ulong)uVar19 << 0x28;
LAB_0010834c:
    uVar25 = uVar25 & 0xffff00ffffff0000 | uVar22;
    uVar22 = uVar24;
    goto LAB_0010834f;
  case 0xaa:
    uVar24 = uVar24 & 0xffff00ffffff0000 | uVar33 | (uVar24 & 0xff00000000) << 8;
    uVar22 = (ulong)((uVar12 & 0x80) + (uint)(bVar17 == 0) * 2 | uVar9 & 0x5d) << 0x28;
    goto LAB_0010834c;
  case 0xb8:
    uVar24 = 0xffff9fffffff0000;
    goto LAB_00108bb0;
  case 0xba:
    uVar22 = uVar24 & 0xffff00ffffff0000 | uVar33 | (uVar32 & 0xff) << 0x28;
    uVar25 = (ulong)uVar26 |
             (ulong)(uVar19 & 0xffff0000) |
             (uVar32 & 0xff) << 0x20 |
             (ulong)((uVar40 & 0x80) + (uint)(state.S == '\0') * 2 | uVar9 & 0x5d) << 0x28 |
             uVar25 & 0xffff000000000000 | 0x200000000000;
    goto LAB_0010835c;
  case 200:
    uVar11 = uVar22 + 0x1000000000000 & 0xff000000000000;
    uVar24 = uVar24 & 0xff00ffffffff0000 | uVar33 | uVar11;
    uVar19 = (uint)(ushort)(uVar22 + 0x1000000000000 >> 0x30);
LAB_00106ded:
    uVar9 = uVar9 & 0x5d;
    uVar19 = uVar19 & 0x80;
LAB_00106df4:
    uVar19 = uVar19 + (uint)(uVar11 == 0) * 2;
    goto LAB_00108339;
  case 0xca:
    uVar11 = uVar22 + 0xff0000000000 & 0xff0000000000;
    uVar24 = uVar24 & 0xffff00ffffff0000 | uVar33 | uVar11;
    uVar19 = ((uint)(uVar22 + 0xff0000000000 >> 0x28) & 0x80) + (uint)(uVar11 == 0) * 2;
    goto LAB_00108c04;
  case 0xd8:
    uVar24 = 0xffffd7ffffff0000;
LAB_00108bb0:
    uVar25 = uVar25 & uVar24;
    uVar22 = uVar14;
LAB_0010834f:
    uVar25 = uVar26 | uVar25;
LAB_00108354:
    uVar25 = uVar25 | 0x200000000000;
    goto LAB_0010835c;
  case 0xe8:
    uVar11 = uVar22 + 0x10000000000 & 0xff0000000000;
    uVar24 = uVar24 & 0xffff00ffffff0000 | uVar33 | uVar11;
    uVar19 = ((uint)(uVar22 + 0x10000000000 >> 0x28) & 0x80) + (uint)(uVar11 == 0) * 2;
LAB_00108c04:
    uVar22 = (ulong)(uVar19 | uVar9 & 0x5d) << 0x28;
    goto LAB_0010834c;
  case 0xf8:
    uVar11 = (ulong)uVar26 | uVar25 & 0xffffd7ffffff0000;
    uVar25 = 0x280000000000;
    uVar22 = uVar14;
  }
LAB_00106f5d:
  uVar25 = uVar25 | uVar11;
LAB_0010835c:
  cVar43.rw_mode = (char)uVar22;
  cVar43._9_1_ = (char)(uVar22 >> 8);
  cVar43.data = (char)(uVar22 >> 0x10);
  cVar43.temp = (char)(uVar22 >> 0x18);
  cVar43.A = (char)(uVar22 >> 0x20);
  cVar43.X = (char)(uVar22 >> 0x28);
  cVar43.Y = (char)(uVar22 >> 0x30);
  cVar43._15_1_ = (char)(uVar22 >> 0x38);
  cVar43.cycle = (short)uVar25;
  cVar43.PC = (short)(uVar25 >> 0x10);
  cVar43.S = (char)(uVar25 >> 0x20);
  cVar43.P = (char)(uVar25 >> 0x28);
  cVar43.address = (short)(uVar25 >> 0x30);
  return cVar43;
switchD_00106286_caseD_3:
  uVar25 = uVar25 & 0xffffffffffff0000;
  goto LAB_00106f5b;
}

Assistant:

static cpu_state cpu_execute(cpu_state state)
{
    if (!state.rdy && state.rw_mode != CPU_RW_MODE_WRITE)
    {
        state.halted = 1;
        return state;
    }

    int was_halted = state.halted;
    state.halted = 0;

    int irq_phase1 = state.irq_phase0;
    state.irq_phase0 = state.irq && !(state.P & CPU_STATUS_FLAG_IRQDISABLE);

    int nmi_phase1 = state.nmi_phase0;
    if (state.nmi_phase0 == 0 && state.nmi)
        state.nmi_phase0 = 1;

    uint8_t cycle = (uint8_t)state.cycle++;
    uint_fast32_t instruction = _CPU_GET_INSTRUCTION(state);

    if (cycle == 0)
    {
        _CPU_SET_INSTRUCTION(state, state.data);
        state.rw_mode = CPU_RW_MODE_NONE;

        switch (state.data)
        {
            case IC_INX: _CPU_SET_REG_X(state, state.X + 1); return state;
            case IC_INY: _CPU_SET_REG_Y(state, state.Y + 1); return state;
            case IC_DEX: _CPU_SET_REG_X(state, state.X - 1); return state;
            case IC_DEY: _CPU_SET_REG_Y(state, state.Y - 1); return state;
            case IC_ROL_ACC: _CPU_ROL(state, state.A); return state;
            case IC_ROR_ACC: _CPU_ROR(state, state.A); return state;
            case IC_ASL_ACC: _CPU_ASL(state, state.A); return state;
            case IC_LSR_ACC: _CPU_LSR(state, state.A); return state;
            case IC_TAX: _CPU_SET_REG_X(state, state.A); return state;
            case IC_TAY: _CPU_SET_REG_Y(state, state.A); return state;
            case IC_TSX: _CPU_SET_REG_X(state, state.S); return state;
            case IC_TXA: _CPU_SET_REG_A(state, state.X); return state;
            case IC_TXS: _CPU_SET_REG_S(state, state.X); return state;
            case IC_TYA: _CPU_SET_REG_A(state, state.Y); return state;
            case IC_CLC: _CPU_SET_REG_P(state, state.P & 0xFE); return state;
            case IC_SEC: _CPU_SET_REG_P(state, state.P | 1); return state;
            case IC_CLI: _CPU_SET_REG_P(state, state.P & 0xFB); return state;
            case IC_SEI: _CPU_SET_REG_P(state, state.P | 0x04); return state;
            case IC_CLV: _CPU_SET_REG_P(state, state.P & 0xBF); return state;
            case IC_CLD: _CPU_SET_REG_P(state, state.P & 0xF7); return state;
            case IC_SED: _CPU_SET_REG_P(state, state.P | 0x08); return state;
            case IC_NOP: 
            case IC_IL_NOP_IMM0: case IC_IL_NOP_IMM1: case IC_IL_NOP_IMM2: case IC_IL_NOP_IMM3: case IC_IL_NOP_IMM4: case IC_IL_NOP_IMM5:
                return state;

            case IC_PHP:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = ((uint8_t)state.S--) + 0x0100;
                state.data = state.P | CPU_STATUS_FLAG_BREAK;
                return state;
            case IC_PHA:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = ((uint8_t)state.S--) + 0x0100;
                state.data = state.A;
                return state;
            case IC_PLP: case IC_PLA:
                state.rw_mode = CPU_RW_MODE_READ; // Dummy read
                state.address = state.PC;
                return state;

            case IC_BRK:
                if (state.temp) // Don't increment PC on hardware interrupt
                {
                    state.rw_mode = CPU_RW_MODE_READ;
                    state.address = state.PC;
                    return state;
                }

            case IC_RTS: case IC_RTI:
            case IC_BCC: case IC_BCS: case IC_BNE: case IC_BEQ: case IC_BVC: case IC_BVS: case IC_BPL: case IC_BMI:
            case IC_JMP: case IC_JMP_IND:
            case IC_BIT_ABS: case IC_BIT_ZP: 
            case IC_LDA_IMM: case IC_LDA_ABS: case IC_LDA_ABS_X: case IC_LDA_ABS_Y: case IC_LDA_ZP: case IC_LDA_ZP_X: case IC_LDA_IND_X: case IC_LDA_IND_Y:
            case IC_LDX_IMM: case IC_LDX_ABS: case IC_LDX_ABS_Y: case IC_LDX_ZP: case IC_LDX_ZP_Y: 
            case IC_LDY_IMM: case IC_LDY_ABS: case IC_LDY_ABS_X: case IC_LDY_ZP: case IC_LDY_ZP_X:
            case IC_STA_ABS: case IC_STA_ABS_X: case IC_STA_ABS_Y: case IC_STA_ZP: case IC_STA_ZP_X: case IC_STA_IND_X: case IC_STA_IND_Y:
            case IC_STX_ABS: case IC_STX_ZP: case IC_STX_ZP_Y: case IC_STY_ABS: case IC_STY_ZP: case IC_STY_ZP_X:
            case IC_ROL_ABS: case IC_ROL_ABS_X: case IC_ROL_ZP: case IC_ROL_ZP_X: 
            case IC_ROR_ABS: case IC_ROR_ABS_X: case IC_ROR_ZP: case IC_ROR_ZP_X: 
            case IC_DEC_ABS: case IC_DEC_ABS_X: case IC_DEC_ZP: case IC_DEC_ZP_X:
            case IC_INC_ABS: case IC_INC_ABS_X: case IC_INC_ZP: case IC_INC_ZP_X:
            case IC_ASL_ABS: case IC_ASL_ABS_X: case IC_ASL_ZP: case IC_ASL_ZP_X: 
            case IC_LSR_ABS: case IC_LSR_ABS_X: case IC_LSR_ZP: case IC_LSR_ZP_X: 
            case IC_AND_IMM: case IC_AND_ABS: case IC_AND_ABS_X: case IC_AND_ABS_Y: case IC_AND_ZP: case IC_AND_ZP_X: case IC_AND_IND_X: case IC_AND_IND_Y:
            case IC_ORA_IMM: case IC_ORA_ABS: case IC_ORA_ABS_X: case IC_ORA_ABS_Y: case IC_ORA_ZP: case IC_ORA_ZP_X: case IC_ORA_IND_X: case IC_ORA_IND_Y:
            case IC_EOR_IMM: case IC_EOR_ABS: case IC_EOR_ABS_X: case IC_EOR_ABS_Y: case IC_EOR_ZP: case IC_EOR_ZP_X: case IC_EOR_IND_X: case IC_EOR_IND_Y:
            case IC_ADC_IMM: case IC_ADC_ABS: case IC_ADC_ABS_X: case IC_ADC_ABS_Y: case IC_ADC_ZP: case IC_ADC_ZP_X: case IC_ADC_IND_X: case IC_ADC_IND_Y:
            case IC_SBC_IMM: case IC_SBC_ABS: case IC_SBC_ABS_X: case IC_SBC_ABS_Y: case IC_SBC_ZP: case IC_SBC_ZP_X: case IC_SBC_IND_X: case IC_SBC_IND_Y:
            case IC_CMP_IMM: case IC_CMP_ABS: case IC_CMP_ABS_X: case IC_CMP_ABS_Y: case IC_CMP_ZP: case IC_CMP_ZP_X: case IC_CMP_IND_X: case IC_CMP_IND_Y:
            case IC_CPX_IMM: case IC_CPX_ABS: case IC_CPX_ZP:
            case IC_CPY_IMM: case IC_CPY_ABS: case IC_CPY_ZP:
            case IC_JSR:
            case IC_IL_ANC_IMM: case IC_IL_AAC_IMM: case IC_IL_ALR_IMM: case IC_IL_ARR_IMM: case IC_IL_AXS_IMM:
            case IC_IL_LAX_IMM: case IC_IL_LAX_ABS: case IC_IL_LAX_ABS_Y: case IC_IL_LAX_ZP: case IC_IL_LAX_ZP_Y: case IC_IL_LAX_IND_X: case IC_IL_LAX_IND_Y:
            case IC_IL_SAX_ABS: case IC_IL_SAX_ZP: case IC_IL_SAX_ZP_Y: case IC_IL_SAX_IND_X:
            case IC_IL_XAA_IMM:
            case IC_IL_LAS_ABS_Y:
            case IC_IL_SHY_ABS_X: case IC_IL_SHX_ABS_Y: case IC_IL_SHA_ABS_Y: case IC_IL_SHA_IND_Y: case IC_IL_TAS_ABS_Y:
            case IC_IL_SBC_IMM:
            case IC_IL_NOP_ZP0: case IC_IL_NOP_ZP1: case IC_IL_NOP_ZP2:
            case IC_IL_NOP_ABS:
            case IC_IL_NOP_ABS_X0: case IC_IL_NOP_ABS_X1: case IC_IL_NOP_ABS_X2: case IC_IL_NOP_ABS_X3: case IC_IL_NOP_ABS_X4: case IC_IL_NOP_ABS_X5:
            case IC_IL_NOP_ZP_X0: case IC_IL_NOP_ZP_X1: case IC_IL_NOP_ZP_X2: case IC_IL_NOP_ZP_X3: case IC_IL_NOP_ZP_X4: case IC_IL_NOP_ZP_X5:
            case IC_IL_NOP_IMP0: case IC_IL_NOP_IMP1: case IC_IL_NOP_IMP2: case IC_IL_NOP_IMP3: case IC_IL_NOP_IMP4:
            case IC_IL_DCP_ABS: case IC_IL_DCP_ABS_X: case IC_IL_DCP_ABS_Y: case IC_IL_DCP_ZP: case IC_IL_DCP_ZP_X: case IC_IL_DCP_IND_X: case IC_IL_DCP_IND_Y:
            case IC_IL_ISB_ABS: case IC_IL_ISB_ABS_X: case IC_IL_ISB_ABS_Y: case IC_IL_ISB_ZP: case IC_IL_ISB_ZP_X: case IC_IL_ISB_IND_X: case IC_IL_ISB_IND_Y:
            case IC_IL_SLO_ABS: case IC_IL_SLO_ABS_X: case IC_IL_SLO_ABS_Y: case IC_IL_SLO_ZP: case IC_IL_SLO_ZP_X: case IC_IL_SLO_IND_X: case IC_IL_SLO_IND_Y:
            case IC_IL_RLA_ABS: case IC_IL_RLA_ABS_X: case IC_IL_RLA_ABS_Y: case IC_IL_RLA_ZP: case IC_IL_RLA_ZP_X: case IC_IL_RLA_IND_X: case IC_IL_RLA_IND_Y:
            case IC_IL_SRE_ABS: case IC_IL_SRE_ABS_X: case IC_IL_SRE_ABS_Y: case IC_IL_SRE_ZP: case IC_IL_SRE_ZP_X: case IC_IL_SRE_IND_X: case IC_IL_SRE_IND_Y:
            case IC_IL_RRA_ABS: case IC_IL_RRA_ABS_X: case IC_IL_RRA_ABS_Y: case IC_IL_RRA_ZP: case IC_IL_RRA_ZP_X: case IC_IL_RRA_IND_X: case IC_IL_RRA_IND_Y:

                /* fetch first operand */
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = state.PC++;
                return state;

            default: 
                // Unknown instruction, treated as NOP
                return state;
        }
    }
    else if (cycle == 1)
    {
        state.rw_mode = CPU_RW_MODE_NONE;
        switch (instruction)
        {
            case IC_BRK:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.data = state.PC >> 8;
                state.address = ((uint8_t)state.S--) + 0x0100;
                return state;
            case IC_ADC_IMM: _CPU_ADC(state); break;
            case IC_AND_IMM: _CPU_SET_REG_A(state, state.A & state.data); break;
            case IC_ORA_IMM: _CPU_SET_REG_A(state, state.A | state.data); break;
            case IC_EOR_IMM: _CPU_SET_REG_A(state, state.A ^ state.data); break;
            case IC_LDA_IMM: _CPU_SET_REG_A(state, state.data); break;
            case IC_LDX_IMM: _CPU_SET_REG_X(state, state.data); break;
            case IC_LDY_IMM: _CPU_SET_REG_Y(state, state.data); break;
            case IC_IL_LAX_IMM: _CPU_LAX(state); break;
            case IC_IL_ANC_IMM: 
            case IC_IL_AAC_IMM: _CPU_ANC(state); break;
            case IC_IL_ALR_IMM: _CPU_ALR(state); break;
            case IC_IL_ARR_IMM: _CPU_ARR(state); break;
            case IC_IL_AXS_IMM: _CPU_AXS(state); break;
            case IC_IL_XAA_IMM: _CPU_XAA(state); break;
            case IC_IL_SBC_IMM:
            case IC_SBC_IMM: _CPU_SBC(state); break;
            case IC_CMP_IMM: _CPU_CMP(state, state.A); break;
            case IC_CPX_IMM: _CPU_CMP(state, state.X); break;
            case IC_CPY_IMM: _CPU_CMP(state, state.Y); break;
            case IC_BCC:     _CPU_COND_BRANCH(state, (state.P & 0x01) == 0); break;
            case IC_BCS:     _CPU_COND_BRANCH(state, (state.P & 0x01)); break;
            case IC_BNE:     _CPU_COND_BRANCH(state, (state.P & 0x02) == 0); break;
            case IC_BEQ:     _CPU_COND_BRANCH(state, (state.P & 0x02)); break;
            case IC_BVC:     _CPU_COND_BRANCH(state, (state.P & 0x40) == 0); break;
            case IC_BVS:     _CPU_COND_BRANCH(state, (state.P & 0x40)); break;
            case IC_BPL:     _CPU_COND_BRANCH(state, (state.P & 0x80) == 0); break;
            case IC_BMI:     _CPU_COND_BRANCH(state, (state.P & 0x80)); break;
            case IC_LDA_ABS: case IC_LDA_ABS_X: case IC_LDA_ABS_Y:
            case IC_LDX_ABS: case IC_LDX_ABS_Y:
            case IC_LDY_ABS: case IC_LDY_ABS_X:
            case IC_STA_ABS: case IC_STA_ABS_X: case IC_STA_ABS_Y:
            case IC_STX_ABS:
            case IC_STY_ABS:
            case IC_IL_LAS_ABS_Y:
            case IC_IL_SHY_ABS_X: case IC_IL_SHX_ABS_Y: case IC_IL_SHA_ABS_Y: case IC_IL_TAS_ABS_Y:
            case IC_ROL_ABS: case IC_ROL_ABS_X:
            case IC_ROR_ABS: case IC_ROR_ABS_X:
            case IC_ASL_ABS: case IC_ASL_ABS_X:
            case IC_LSR_ABS: case IC_LSR_ABS_X:
            case IC_DEC_ABS: case IC_DEC_ABS_X:
            case IC_INC_ABS: case IC_INC_ABS_X:
            case IC_AND_ABS: case IC_AND_ABS_X: case IC_AND_ABS_Y:
            case IC_ORA_ABS: case IC_ORA_ABS_X: case IC_ORA_ABS_Y:
            case IC_EOR_ABS: case IC_EOR_ABS_X: case IC_EOR_ABS_Y:
            case IC_ADC_ABS: case IC_ADC_ABS_X: case IC_ADC_ABS_Y:
            case IC_SBC_ABS: case IC_SBC_ABS_X: case IC_SBC_ABS_Y:
            case IC_CMP_ABS: case IC_CMP_ABS_X: case IC_CMP_ABS_Y:
            case IC_CPX_ABS:
            case IC_CPY_ABS:
            case IC_BIT_ABS:
            case IC_JMP: case IC_JMP_IND:
            case IC_IL_NOP_ABS:
            case IC_IL_NOP_ABS_X0: case IC_IL_NOP_ABS_X1: case IC_IL_NOP_ABS_X2: case IC_IL_NOP_ABS_X3: case IC_IL_NOP_ABS_X4: case IC_IL_NOP_ABS_X5:
            case IC_IL_LAX_ABS: case IC_IL_LAX_ABS_Y:
            case IC_IL_SAX_ABS:
            case IC_IL_DCP_ABS: case IC_IL_DCP_ABS_X: case IC_IL_DCP_ABS_Y:
            case IC_IL_ISB_ABS: case IC_IL_ISB_ABS_X: case IC_IL_ISB_ABS_Y:
            case IC_IL_SLO_ABS: case IC_IL_SLO_ABS_X: case IC_IL_SLO_ABS_Y:
            case IC_IL_RLA_ABS: case IC_IL_RLA_ABS_X: case IC_IL_RLA_ABS_Y:
            case IC_IL_SRE_ABS: case IC_IL_SRE_ABS_X: case IC_IL_SRE_ABS_Y:
            case IC_IL_RRA_ABS: case IC_IL_RRA_ABS_X: case IC_IL_RRA_ABS_Y:

                /* fetch high byte of absolute address */
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = state.PC++;
                state.temp = state.data;
                return state;

            case IC_LDA_ZP:
            case IC_LDX_ZP:
            case IC_LDY_ZP:
            case IC_BIT_ZP:
            case IC_ROL_ZP:
            case IC_ROR_ZP:
            case IC_ASL_ZP:
            case IC_LSR_ZP:
            case IC_ADC_ZP:
            case IC_SBC_ZP:
            case IC_CMP_ZP:
            case IC_CPX_ZP:
            case IC_CPY_ZP:
            case IC_DEC_ZP:
            case IC_INC_ZP:
            case IC_AND_ZP:
            case IC_ORA_ZP:
            case IC_EOR_ZP:
            case IC_IL_NOP_ZP0: case IC_IL_NOP_ZP1: case IC_IL_NOP_ZP2:
            case IC_IL_LAX_ZP:
            case IC_IL_DCP_ZP:
            case IC_IL_ISB_ZP:
            case IC_IL_SLO_ZP:
            case IC_IL_RLA_ZP:
            case IC_IL_SRE_ZP:
            case IC_IL_RRA_ZP:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = state.data;
                return state;
            case IC_LDA_ZP_X:
            case IC_LDY_ZP_X:
            case IC_ROL_ZP_X:
            case IC_ROR_ZP_X:
            case IC_ASL_ZP_X:
            case IC_LSR_ZP_X:
            case IC_ADC_ZP_X:
            case IC_SBC_ZP_X:
            case IC_CMP_ZP_X:
            case IC_DEC_ZP_X:
            case IC_INC_ZP_X:
            case IC_AND_ZP_X:
            case IC_ORA_ZP_X:
            case IC_EOR_ZP_X:
            case IC_IL_NOP_ZP_X0: case IC_IL_NOP_ZP_X1: case IC_IL_NOP_ZP_X2: case IC_IL_NOP_ZP_X3: case IC_IL_NOP_ZP_X4: case IC_IL_NOP_ZP_X5:
            case IC_IL_DCP_ZP_X:
            case IC_IL_ISB_ZP_X:
            case IC_IL_SLO_ZP_X:
            case IC_IL_RLA_ZP_X:
            case IC_IL_SRE_ZP_X:
            case IC_IL_RRA_ZP_X:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.data + state.X) & 0xFF;
                return state; 
            case IC_LDX_ZP_Y:
            case IC_IL_LAX_ZP_Y:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.data + state.Y) & 0xFF;
                return state;
            case IC_STA_ZP:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = state.data;
                state.data = state.A;
                return state;
            case IC_STA_ZP_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = (state.data + state.X) & 0xFF;
                state.data = state.A;
                return state;
            case IC_STX_ZP:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = state.data;
                state.data = state.X;
                return state;
            case IC_STX_ZP_Y:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = (state.data + state.Y) & 0xFF;
                state.data = state.X;
                return state;
            case IC_STY_ZP:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = state.data;
                state.data = state.Y;
                return state;
            case IC_STY_ZP_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = (state.data + state.X) & 0xFF;
                state.data = state.Y;
                return state;
            case IC_IL_SAX_ZP:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = state.data;
                state.data = state.A & state.X;
                return state;
            case IC_IL_SAX_ZP_Y:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = (state.data + state.Y) & 0xFF;
                state.data = state.A & state.X;
                return state;
            case IC_LDA_IND_X:
            case IC_STA_IND_X:
            case IC_ADC_IND_X:
            case IC_SBC_IND_X:
            case IC_CMP_IND_X:
            case IC_AND_IND_X:
            case IC_ORA_IND_X:
            case IC_EOR_IND_X:
            case IC_IL_LAX_IND_X:
            case IC_IL_SAX_IND_X:
            case IC_IL_DCP_IND_X:
            case IC_IL_ISB_IND_X:
            case IC_IL_SLO_IND_X:
            case IC_IL_RLA_IND_X:
            case IC_IL_SRE_IND_X:
            case IC_IL_RRA_IND_X:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.data + state.X) & 0xFF;
                return state;
            case IC_LDA_IND_Y:
            case IC_STA_IND_Y:
            case IC_ADC_IND_Y:
            case IC_SBC_IND_Y:
            case IC_CMP_IND_Y:
            case IC_AND_IND_Y:
            case IC_ORA_IND_Y:
            case IC_EOR_IND_Y:
            case IC_IL_LAX_IND_Y:
            case IC_IL_DCP_IND_Y:
            case IC_IL_ISB_IND_Y:
            case IC_IL_SLO_IND_Y:
            case IC_IL_RLA_IND_Y:
            case IC_IL_SRE_IND_Y:
            case IC_IL_RRA_IND_Y:
            case IC_IL_SHA_IND_Y:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = state.data;
                return state;
            case IC_JSR:
                state.rw_mode = CPU_RW_MODE_NONE;
                state.temp = state.data;
                return state;
            case IC_RTS: case IC_RTI: case IC_PLA: case IC_PLP:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = ((uint8_t)++state.S) + 0x0100;
                return state;
            case IC_PHA:
            case IC_PHP:
                state.rw_mode = CPU_RW_MODE_NONE;
                // empty cycle
                return state;
            default:
                break;
        }
    }
    else if (cycle == 2)
    {
        switch (instruction)
        {
            case IC_BRK:
                state.data = (uint8_t)state.PC;
                state.address = ((uint8_t)state.S--) + 0x0100;
                return state;

            case IC_BCC: case IC_BCS: case IC_BNE: case IC_BEQ: case IC_BVC: case IC_BVS: case IC_BPL: case IC_BMI:
                _CPU_COND_BRANCH_TAKEN(state);
                break;

            case IC_LDA_ABS:
            case IC_LDX_ABS:
            case IC_LDY_ABS:
            case IC_ROL_ABS:
            case IC_ROR_ABS:
            case IC_DEC_ABS:
            case IC_INC_ABS:
            case IC_ASL_ABS:
            case IC_LSR_ABS:
            case IC_ADC_ABS:
            case IC_SBC_ABS:
            case IC_CMP_ABS:
            case IC_CPX_ABS:
            case IC_CPY_ABS:
            case IC_AND_ABS:
            case IC_ORA_ABS:
            case IC_EOR_ABS:
            case IC_BIT_ABS:
            case IC_IL_NOP_ABS:
            case IC_IL_LAX_ABS:
            case IC_IL_DCP_ABS:
            case IC_IL_ISB_ABS:
            case IC_IL_SLO_ABS:
            case IC_IL_RLA_ABS:
            case IC_IL_SRE_ABS:
            case IC_IL_RRA_ABS:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.data << 8) | state.temp;
                return state;
            case IC_LDA_ABS_X:
            case IC_LDY_ABS_X:
            case IC_STA_ABS_X:
            case IC_ROL_ABS_X:
            case IC_ROR_ABS_X:
            case IC_DEC_ABS_X:
            case IC_INC_ABS_X:
            case IC_ASL_ABS_X:
            case IC_LSR_ABS_X:
            case IC_ADC_ABS_X:
            case IC_SBC_ABS_X:
            case IC_CMP_ABS_X:
            case IC_AND_ABS_X:
            case IC_ORA_ABS_X:
            case IC_EOR_ABS_X:
            case IC_IL_NOP_ABS_X0: case IC_IL_NOP_ABS_X1: case IC_IL_NOP_ABS_X2: case IC_IL_NOP_ABS_X3: case IC_IL_NOP_ABS_X4: case IC_IL_NOP_ABS_X5:
            case IC_IL_DCP_ABS_X:
            case IC_IL_ISB_ABS_X:
            case IC_IL_SLO_ABS_X:
            case IC_IL_RLA_ABS_X:
            case IC_IL_SRE_ABS_X:
            case IC_IL_RRA_ABS_X:
            case IC_IL_SHY_ABS_X:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.data << 8) | ((state.temp + state.X) & 0xFF);
                state.temp = ((uint16_t)state.temp + (uint16_t)state.X) >> 8;
                return state;
            case IC_LDA_ABS_Y:
            case IC_LDX_ABS_Y:
            case IC_STA_ABS_Y:
            case IC_ADC_ABS_Y:
            case IC_SBC_ABS_Y:
            case IC_CMP_ABS_Y:
            case IC_AND_ABS_Y:
            case IC_ORA_ABS_Y:
            case IC_EOR_ABS_Y:
            case IC_IL_LAX_ABS_Y:
            case IC_IL_DCP_ABS_Y:
            case IC_IL_ISB_ABS_Y:
            case IC_IL_SLO_ABS_Y:
            case IC_IL_RLA_ABS_Y:
            case IC_IL_SRE_ABS_Y:
            case IC_IL_RRA_ABS_Y:
            case IC_IL_LAS_ABS_Y:
            case IC_IL_SHX_ABS_Y:
            case IC_IL_SHA_ABS_Y:
            case IC_IL_TAS_ABS_Y:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.data << 8) | ((state.temp + state.Y) & 0xFF);
                state.temp = ((uint16_t)state.temp + (uint16_t)state.Y) >> 8;
                return state;
            case IC_STA_ABS:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = (state.data << 8) | state.temp;
                state.data = state.A;
                return state;
            case IC_STX_ABS:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = (state.data << 8) | state.temp;
                state.data = state.X;
                return state;
            case IC_STY_ABS:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = (state.data << 8) | state.temp;
                state.data = state.Y;
                return state;
            case IC_IL_SAX_ABS:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = (state.data << 8) | state.temp;
                state.data = state.A & state.X;
                return state;
            case IC_LDA_IND_X:
            case IC_LDA_IND_Y:
            case IC_STA_IND_X:
            case IC_STA_IND_Y:
            case IC_ADC_IND_X:
            case IC_ADC_IND_Y:
            case IC_SBC_IND_X:
            case IC_SBC_IND_Y:
            case IC_CMP_IND_X:
            case IC_CMP_IND_Y:
            case IC_AND_IND_X:
            case IC_AND_IND_Y:
            case IC_ORA_IND_X:
            case IC_ORA_IND_Y:
            case IC_EOR_IND_X:
            case IC_EOR_IND_Y:
            case IC_IL_LAX_IND_X:
            case IC_IL_LAX_IND_Y:
            case IC_IL_SAX_IND_X:
            case IC_IL_DCP_IND_X:
            case IC_IL_DCP_IND_Y:
            case IC_IL_ISB_IND_X:
            case IC_IL_ISB_IND_Y:
            case IC_IL_SLO_IND_X:
            case IC_IL_SLO_IND_Y:
            case IC_IL_RLA_IND_X:
            case IC_IL_RLA_IND_Y:
            case IC_IL_SRE_IND_X:
            case IC_IL_SRE_IND_Y:
            case IC_IL_RRA_IND_X:
            case IC_IL_RRA_IND_Y:
            case IC_IL_SHA_IND_Y:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.address + 1) & 0xFF;
                state.temp = state.data;
                return state;
            case IC_JMP:
                state.rw_mode = CPU_RW_MODE_NONE;
                state.PC = (state.data << 8) | state.temp;
                break;
            case IC_JMP_IND:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.data << 8) | state.temp;
                return state;
            case IC_BIT_ZP: _CPU_BIT(state); break;
            case IC_LDA_ZP: _CPU_SET_REG_A(state, state.data); break;
            case IC_LDX_ZP: _CPU_SET_REG_X(state, state.data); break;
            case IC_LDY_ZP: _CPU_SET_REG_Y(state, state.data); break;
            case IC_ADC_ZP: _CPU_ADC(state); break;
            case IC_SBC_ZP: _CPU_SBC(state); break;
            case IC_CMP_ZP: _CPU_CMP(state, state.A); break;
            case IC_CPX_ZP: _CPU_CMP(state, state.X); break;
            case IC_CPY_ZP: _CPU_CMP(state, state.Y); break;
            case IC_AND_ZP: _CPU_SET_REG_A(state, state.A & state.data); break;
            case IC_ORA_ZP: _CPU_SET_REG_A(state, state.A | state.data); break;
            case IC_EOR_ZP: _CPU_SET_REG_A(state, state.A ^ state.data); break;
            case IC_IL_LAX_ZP: _CPU_LAX(state); break;
            case IC_LDA_ZP_X:
                _CPU_SET_REG_A(state, state.data);
                return state; 
            case IC_LDY_ZP_X:
                _CPU_SET_REG_Y(state, state.data);
                return state;
            case IC_LDX_ZP_Y:
                _CPU_SET_REG_X(state, state.data);
                return state;
            case IC_IL_LAX_ZP_Y:
                _CPU_LAX(state);
                return state;
            case IC_JSR:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.data = (state.PC >> 8);
                state.address = ((uint8_t)state.S--) + 0x0100;
                return state;
            case IC_RTI:
                state.rw_mode = CPU_RW_MODE_READ;
                _CPU_SET_REG_P(state, state.data & ~CPU_STATUS_FLAG_BREAK);
                state.address = ((uint8_t)++state.S) + 0x0100;
                return state;
            case IC_RTS:
                state.rw_mode = CPU_RW_MODE_NONE;
                return state;
            case IC_PLA:
                state.rw_mode = CPU_RW_MODE_NONE;
                _CPU_SET_REG_A(state, state.data);
                return state;
            case IC_PLP:
                state.rw_mode = CPU_RW_MODE_NONE;
                _CPU_SET_REG_P(state, state.data & ~CPU_STATUS_FLAG_BREAK);
                return state;

            case IC_ROL_ZP:
            case IC_ROL_ZP_X:
            case IC_ROR_ZP:
            case IC_ROR_ZP_X:
            case IC_DEC_ZP:
            case IC_DEC_ZP_X:
            case IC_INC_ZP:
            case IC_INC_ZP_X:
            case IC_ASL_ZP:
            case IC_ASL_ZP_X:
            case IC_LSR_ZP:
            case IC_LSR_ZP_X:
            case IC_IL_SAX_ZP_Y:
            case IC_IL_DCP_ZP:
            case IC_IL_DCP_ZP_X:
            case IC_IL_ISB_ZP:
            case IC_IL_ISB_ZP_X:
            case IC_IL_SLO_ZP:
            case IC_IL_SLO_ZP_X:
            case IC_IL_RLA_ZP:
            case IC_IL_RLA_ZP_X:
            case IC_IL_SRE_ZP:
            case IC_IL_SRE_ZP_X:
            case IC_IL_RRA_ZP:
            case IC_IL_RRA_ZP_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                return state;

            case IC_STA_ZP_X:
            case IC_STX_ZP_Y:
            case IC_STY_ZP_X:
            case IC_ADC_ZP_X:
            case IC_SBC_ZP_X:
            case IC_CMP_ZP_X:
            case IC_AND_ZP_X:
            case IC_ORA_ZP_X:
            case IC_EOR_ZP_X:
            case IC_IL_NOP_ZP_X0: case IC_IL_NOP_ZP_X1: case IC_IL_NOP_ZP_X2: case IC_IL_NOP_ZP_X3: case IC_IL_NOP_ZP_X4: case IC_IL_NOP_ZP_X5:
                state.rw_mode = CPU_RW_MODE_NONE;
                // empty cycles
                return state;
            default: break;
        }
    }
    else if (cycle == 3)
    {
        switch(instruction)
        {
            case IC_BRK:
                state.data = state.P;
                if (state.temp == 0 || state.temp == 0xFC)
                    state.data |= CPU_STATUS_FLAG_BREAK;

                if (state.nmi_phase0)
                {
                    state.nmi = 0;
                    state.nmi_phase0 = 0;
                    state.temp = 0xFA;
                }
                else if (state.irq_phase0 || state.temp == 0)
                {
                    state.temp = 0xFE;
                }

                state.address = ((uint8_t)state.S--) + 0x0100;
                return state;

            case IC_LDA_ABS: _CPU_SET_REG_A(state, state.data); break;
            case IC_LDX_ABS: _CPU_SET_REG_X(state, state.data); break;
            case IC_LDY_ABS: _CPU_SET_REG_Y(state, state.data); break;
            case IC_IL_LAX_ABS: _CPU_LAX(state); break;
            case IC_ADC_ABS: case IC_ADC_ZP_X: _CPU_ADC(state); break;
            case IC_SBC_ABS: case IC_SBC_ZP_X: _CPU_SBC(state); break;
            case IC_CMP_ABS: case IC_CMP_ZP_X: _CPU_CMP(state, state.A); break;
            case IC_CPX_ABS: _CPU_CMP(state, state.X); break;
            case IC_CPY_ABS: _CPU_CMP(state, state.Y); break;
            case IC_AND_ABS: case IC_AND_ZP_X: _CPU_SET_REG_A(state, state.A & state.data); break;
            case IC_ORA_ABS: case IC_ORA_ZP_X: _CPU_SET_REG_A(state, state.A | state.data); break;
            case IC_EOR_ABS: case IC_EOR_ZP_X: _CPU_SET_REG_A(state, state.A ^ state.data); break;

            case IC_IL_NOP_ABS_X0: case IC_IL_NOP_ABS_X1: case IC_IL_NOP_ABS_X2: case IC_IL_NOP_ABS_X3: case IC_IL_NOP_ABS_X4: case IC_IL_NOP_ABS_X5:
                _CPU_CHECK_PAGE_CROSS(state);
                break;

            case IC_LDA_ABS_X: case IC_LDA_ABS_Y:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_SET_REG_A(state, state.data);
                break;

            case IC_LDX_ABS_Y:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_SET_REG_X(state, state.data);
                break;

            case IC_LDY_ABS_X:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_SET_REG_Y(state, state.data);
                break;

            case IC_IL_LAX_ABS_Y:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_LAX(state);
                break;

            case IC_ADC_ABS_X: case IC_ADC_ABS_Y:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_ADC(state); 
                break;

            case IC_SBC_ABS_X: case IC_SBC_ABS_Y:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_SBC(state); 
                break;

            case IC_CMP_ABS_X: case IC_CMP_ABS_Y:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_CMP(state, state.A);
                break;

            case IC_AND_ABS_X: case IC_AND_ABS_Y:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_SET_REG_A(state, state.A & state.data); 
                break;

            case IC_ORA_ABS_X: case IC_ORA_ABS_Y:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_SET_REG_A(state, state.A | state.data); 
                break;

            case IC_EOR_ABS_X: case IC_EOR_ABS_Y:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_SET_REG_A(state, state.A ^ state.data); 
                break;

            case IC_IL_LAS_ABS_Y:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_LAS(state);
                break;

            case IC_STA_ABS_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address += state.temp * 0x0100;
                state.data = state.A;
                return state;

            case IC_STA_ABS_Y:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address += state.temp * 0x0100;
                state.data = state.A;
                return state;

            case IC_ROL_ABS_X:
            case IC_ROR_ABS_X:
            case IC_DEC_ABS_X:
            case IC_INC_ABS_X:
            case IC_ASL_ABS_X:
            case IC_LSR_ABS_X:
            case IC_IL_DCP_ABS_X: case IC_IL_DCP_ABS_Y: 
            case IC_IL_ISB_ABS_X: case IC_IL_ISB_ABS_Y: 
            case IC_IL_SLO_ABS_X: case IC_IL_SLO_ABS_Y: 
            case IC_IL_RLA_ABS_X: case IC_IL_RLA_ABS_Y: 
            case IC_IL_SRE_ABS_X: case IC_IL_SRE_ABS_Y: 
            case IC_IL_RRA_ABS_X: case IC_IL_RRA_ABS_Y: 
                state.rw_mode = CPU_RW_MODE_READ;
                state.address += state.temp * 0x0100;
                return state;
            case IC_IL_SHY_ABS_X:
                _CPU_SHAXY(state, state.Y, was_halted);
                return state;
            case IC_IL_SHX_ABS_Y:
                _CPU_SHAXY(state, state.X, was_halted);
                return state;
            case IC_IL_SHA_ABS_Y:
                _CPU_SHAXY(state, (state.A & state.X), was_halted);
                return state;
            case IC_IL_TAS_ABS_Y:
                state.S = state.A & state.X;
                _CPU_SHAXY(state, state.S, was_halted);
                return state;
            case IC_ROL_ABS: 
            case IC_ROR_ABS: 
            case IC_DEC_ABS: 
            case IC_INC_ABS: 
            case IC_ASL_ABS:
            case IC_LSR_ABS: 
            case IC_IL_DCP_ABS: 
            case IC_IL_ISB_ABS: 
            case IC_IL_SLO_ABS: 
            case IC_IL_RLA_ABS: 
            case IC_IL_SRE_ABS: 
            case IC_IL_RRA_ABS: 
                state.rw_mode = CPU_RW_MODE_WRITE;
                return state;

            case IC_ROL_ZP: case IC_ROL_ZP_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_ROL(state, state.data);
                return state;

            case IC_ROR_ZP: case IC_ROR_ZP_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_ROR(state, state.data);
                return state;

            case IC_DEC_ZP: case IC_DEC_ZP_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_DEC(state);
                return state;

            case IC_INC_ZP: case IC_INC_ZP_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_INC(state);
                return state;

            case IC_ASL_ZP: case IC_ASL_ZP_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_ASL(state, state.data);
                return state;

            case IC_LSR_ZP: case IC_LSR_ZP_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_LSR(state, state.data);
                return state;

            case IC_IL_DCP_ZP: case IC_IL_DCP_ZP_X:
                _CPU_DCP(state);
                return state;

            case IC_IL_ISB_ZP: case IC_IL_ISB_ZP_X:
                _CPU_ISB(state);
                return state;

            case IC_IL_SLO_ZP: case IC_IL_SLO_ZP_X:
                _CPU_SLO(state);
                return state;

            case IC_IL_RLA_ZP: case IC_IL_RLA_ZP_X:
                _CPU_RLA(state);
                return state;

            case IC_IL_SRE_ZP: case IC_IL_SRE_ZP_X:
                _CPU_SRE(state);
                return state;

            case IC_IL_RRA_ZP: case IC_IL_RRA_ZP_X:
                _CPU_RRA(state);
                return state;

            case IC_BIT_ABS:    _CPU_BIT(state); break;

            case IC_LDA_IND_X:
            case IC_ADC_IND_X:
            case IC_SBC_IND_X:
            case IC_CMP_IND_X:
            case IC_AND_IND_X:
            case IC_ORA_IND_X:
            case IC_EOR_IND_X:
            case IC_IL_LAX_IND_X:
            case IC_IL_DCP_IND_X:
            case IC_IL_ISB_IND_X:
            case IC_IL_SLO_IND_X:
            case IC_IL_RLA_IND_X:
            case IC_IL_SRE_IND_X:
            case IC_IL_RRA_IND_X:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.data << 8) | state.temp;
                return state;
            case IC_LDA_IND_Y:
            case IC_ADC_IND_Y:
            case IC_SBC_IND_Y:
            case IC_CMP_IND_Y:
            case IC_AND_IND_Y:
            case IC_ORA_IND_Y:
            case IC_EOR_IND_Y:
            case IC_IL_LAX_IND_Y:
            case IC_IL_DCP_IND_Y:
            case IC_IL_ISB_IND_Y:
            case IC_IL_SLO_IND_Y:
            case IC_IL_RLA_IND_Y:
            case IC_IL_SRE_IND_Y:
            case IC_IL_RRA_IND_Y:
            case IC_IL_SHA_IND_Y:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.data << 8) | ((state.temp + state.Y) & 0xFF);
                state.temp = ((uint16_t)state.temp + (uint16_t)state.Y) >> 8;
                return state;
            case IC_STA_IND_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = (state.data << 8) | state.temp;
                state.data = state.A;
                return state;
            case IC_STA_IND_Y:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.data << 8) | ((state.temp + state.Y) & 0xFF);
                state.temp = ((uint16_t)state.temp + (uint16_t)state.Y) >> 8;
                return state;
            case IC_IL_SAX_IND_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = (state.data << 8) | state.temp;
                state.data = state.A & state.X;
                return state;
            case IC_JMP_IND:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.address & 0xFF00) | ((state.address + 1) & 0x00FF);
                state.temp = state.data;
                return state;
            case IC_JSR:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.data = state.PC & 0xFF;
                state.address = ((uint8_t)state.S--) + 0x0100;
                return state;
            case IC_RTS:
            case IC_RTI:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = ((uint8_t)++state.S) + 0x0100;
                state.temp = state.data;
                return state;

           default: break;
        }
    }
    else if (cycle == 4)
    {
        state.rw_mode = CPU_RW_MODE_NONE;
        switch (instruction)
        {
            case IC_BRK:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = 0xFF00 | state.temp;
                _CPU_SET_REG_P(state, state.P | CPU_STATUS_FLAG_IRQDISABLE);
                return state;

             case IC_LDA_ABS_X: case IC_LDA_ABS_Y:
                _CPU_SET_REG_A(state, state.data);
                break;

            case IC_LDX_ABS_Y:
                _CPU_SET_REG_X(state, state.data);
                break;

            case IC_LDY_ABS_X:
                _CPU_SET_REG_Y(state, state.data);
                break;

            case IC_IL_LAX_ABS_Y:
                _CPU_LAX(state);
                break;

            case IC_ADC_ABS_X: case IC_ADC_ABS_Y:
                _CPU_ADC(state); 
                break;

            case IC_SBC_ABS_X: case IC_SBC_ABS_Y:
                _CPU_SBC(state); 
                break;

            case IC_CMP_ABS_X: case IC_CMP_ABS_Y:
                _CPU_CMP(state, state.A);
                break;

            case IC_AND_ABS_X: case IC_AND_ABS_Y:
                _CPU_SET_REG_A(state, state.A & state.data); 
                break;

            case IC_ORA_ABS_X: case IC_ORA_ABS_Y:
                _CPU_SET_REG_A(state, state.A | state.data); 
                break;

            case IC_EOR_ABS_X: case IC_EOR_ABS_Y:
                _CPU_SET_REG_A(state, state.A ^ state.data); 
                break;

            case IC_IL_LAS_ABS_Y:
                _CPU_LAS(state);
                break;

            case IC_ROL_ABS_X:
            case IC_ROR_ABS_X:
            case IC_DEC_ABS_X:
            case IC_INC_ABS_X:
            case IC_ASL_ABS_X:
            case IC_LSR_ABS_X:
            case IC_IL_DCP_ABS_X: case IC_IL_DCP_ABS_Y:
            case IC_IL_ISB_ABS_X: case IC_IL_ISB_ABS_Y:
            case IC_IL_SLO_ABS_X: case IC_IL_SLO_ABS_Y:
            case IC_IL_RLA_ABS_X: case IC_IL_RLA_ABS_Y:
            case IC_IL_SRE_ABS_X: case IC_IL_SRE_ABS_Y:
            case IC_IL_RRA_ABS_X: case IC_IL_RRA_ABS_Y:
                state.rw_mode = CPU_RW_MODE_WRITE;
                return state;

            case IC_LDA_IND_X: _CPU_SET_REG_A(state, state.data); return state;
            case IC_ADC_IND_X: _CPU_ADC(state); return state;
            case IC_SBC_IND_X: _CPU_SBC(state); return state;
            case IC_CMP_IND_X: _CPU_CMP(state, state.A); return state;
            case IC_AND_IND_X: _CPU_SET_REG_A(state, state.A & state.data); return state;
            case IC_ORA_IND_X: _CPU_SET_REG_A(state, state.A | state.data); return state;
            case IC_EOR_IND_X: _CPU_SET_REG_A(state, state.A ^ state.data); return state;
            case IC_IL_LAX_IND_X: _CPU_LAX(state); return state;

            case IC_LDA_IND_Y: _CPU_CHECK_PAGE_CROSS(state); _CPU_SET_REG_A(state, state.data); break;
            case IC_ADC_IND_Y: _CPU_CHECK_PAGE_CROSS(state); _CPU_ADC(state); break;
            case IC_SBC_IND_Y: _CPU_CHECK_PAGE_CROSS(state); _CPU_SBC(state); break;
            case IC_CMP_IND_Y: _CPU_CHECK_PAGE_CROSS(state); _CPU_CMP(state, state.A); break;
            case IC_AND_IND_Y: _CPU_CHECK_PAGE_CROSS(state); _CPU_SET_REG_A(state, state.A & state.data); break;
            case IC_ORA_IND_Y: _CPU_CHECK_PAGE_CROSS(state); _CPU_SET_REG_A(state, state.A | state.data); break;
            case IC_EOR_IND_Y: _CPU_CHECK_PAGE_CROSS(state); _CPU_SET_REG_A(state, state.A ^ state.data); break;
            case IC_IL_LAX_IND_Y: _CPU_CHECK_PAGE_CROSS(state); _CPU_LAX(state); break;

            case IC_STA_IND_Y:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address += state.temp * 0x0100;
                state.data = state.A;
                return state;

            case IC_JMP_IND:
                state.PC = (state.data << 8) | state.temp;
                break;
            case IC_JSR:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = state.PC;
                return state;

            case IC_IL_DCP_IND_X:
            case IC_IL_ISB_IND_X:
            case IC_IL_SLO_IND_X: 
            case IC_IL_RLA_IND_X: 
            case IC_IL_SRE_IND_X: 
            case IC_IL_RRA_IND_X: 
                /* empty cycle */
                return state;

            case IC_IL_DCP_IND_Y:
            case IC_IL_ISB_IND_Y:
            case IC_IL_SLO_IND_Y:
            case IC_IL_RLA_IND_Y:
            case IC_IL_SRE_IND_Y:
            case IC_IL_RRA_IND_Y:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address += state.temp * 0x0100;
                return state;

            case IC_IL_SHA_IND_Y:
                _CPU_SHAXY(state, (state.A & state.X), was_halted);
                return state;

            case IC_ROL_ABS:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_ROL(state, state.data);
                return state;

            case IC_ROR_ABS:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_ROR(state, state.data);
                return state;

            case IC_DEC_ABS:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_DEC(state);
                return state;

            case IC_INC_ABS:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_INC(state);
                return state;

            case IC_ASL_ABS:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_ASL(state, state.data);
                return state;

            case IC_LSR_ABS: 
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_LSR(state, state.data);
                return state;

            case IC_IL_DCP_ABS: 
                _CPU_DCP(state);
                return state;

            case IC_IL_ISB_ABS: 
                _CPU_ISB(state);
                return state;

            case IC_IL_SLO_ABS: 
                _CPU_SLO(state);
                return state;

            case IC_IL_RLA_ABS: 
                _CPU_RLA(state);
                return state;

            case IC_IL_SRE_ABS: 
                _CPU_SRE(state);
                return state;

            case IC_IL_RRA_ABS: 
                _CPU_RRA(state);
                return state;

            case IC_ROL_ZP_X:
            case IC_ROR_ZP_X:
            case IC_DEC_ZP_X:
            case IC_INC_ZP_X:
            case IC_ASL_ZP_X:
            case IC_LSR_ZP_X:
            case IC_STA_IND_X:
            case IC_IL_SAX_IND_X:
            case IC_IL_DCP_ZP_X:
            case IC_IL_ISB_ZP_X:
            case IC_IL_SLO_ZP_X:
            case IC_IL_RLA_ZP_X:
            case IC_IL_SRE_ZP_X:
            case IC_IL_RRA_ZP_X:
                state.rw_mode = CPU_RW_MODE_NONE;
                // empty cycles
                return state;
            case IC_RTS:
                state.rw_mode = CPU_RW_MODE_NONE;
                state.PC = ((state.data << 8) | state.temp) + 1;
                return state;
            case IC_RTI:
                state.rw_mode = CPU_RW_MODE_NONE;
                state.PC = (state.data << 8) | state.temp;
                return state;

            default: break;
        }
    }
    else if (cycle == 5)
    {
        state.rw_mode = CPU_RW_MODE_NONE;
        switch (instruction)
        {
            case IC_BRK:
                state.rw_mode = CPU_RW_MODE_READ;
                state.PC = state.data;
                state.address += 1;
                return state;
            case IC_JSR:
                state.PC = (state.data << 8) | state.temp;
                break;

            case IC_IL_DCP_IND_X:
            case IC_IL_DCP_IND_Y:
            case IC_IL_ISB_IND_X:
            case IC_IL_ISB_IND_Y:
            case IC_IL_SLO_IND_X:
            case IC_IL_SLO_IND_Y:
            case IC_IL_RLA_IND_X:
            case IC_IL_RLA_IND_Y:
            case IC_IL_SRE_IND_X:
            case IC_IL_SRE_IND_Y:
            case IC_IL_RRA_IND_X:
            case IC_IL_RRA_IND_Y:
                state.rw_mode = CPU_RW_MODE_WRITE;
                return state;

            case IC_ROL_ABS_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_ROL(state, state.data);
                return state;

            case IC_ROR_ABS_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_ROR(state, state.data);
                return state;

            case IC_DEC_ABS_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_DEC(state);
                return state;

            case IC_INC_ABS_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_INC(state);
                return state;

            case IC_ASL_ABS_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_ASL(state, state.data);
                return state;

            case IC_LSR_ABS_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_LSR(state, state.data);
                return state;

            case IC_IL_DCP_ABS_X: case IC_IL_DCP_ABS_Y:
                _CPU_DCP(state);
                return state;

            case IC_IL_ISB_ABS_X: case IC_IL_ISB_ABS_Y:
                _CPU_ISB(state);
                return state;

            case IC_IL_SLO_ABS_X: case IC_IL_SLO_ABS_Y:
                _CPU_SLO(state);
                return state;

            case IC_IL_RLA_ABS_X: case IC_IL_RLA_ABS_Y:
                _CPU_RLA(state);
                return state;

            case IC_IL_SRE_ABS_X: case IC_IL_SRE_ABS_Y:
                _CPU_SRE(state);
                return state;

            case IC_IL_RRA_ABS_X: case IC_IL_RRA_ABS_Y:
                _CPU_RRA(state);
                return state;

            /* Executed if page-cross */
            case IC_LDA_IND_Y: _CPU_SET_REG_A(state, state.data); break;
            case IC_ADC_IND_Y: _CPU_ADC(state); break;
            case IC_SBC_IND_Y: _CPU_SBC(state); break;
            case IC_CMP_IND_Y: _CPU_CMP(state, state.A); break;
            case IC_AND_IND_Y: _CPU_SET_REG_A(state, state.A & state.data); break;
            case IC_ORA_IND_Y: _CPU_SET_REG_A(state, state.A | state.data); break;
            case IC_EOR_IND_Y: _CPU_SET_REG_A(state, state.A ^ state.data); break;
            case IC_IL_LAX_IND_Y: _CPU_LAX(state); break;
        }
    }
    else if (cycle == 6)
    {
        switch(instruction)
        {
            case IC_BRK:
                state.PC = (state.data << 8) | state.PC;
                nmi_phase1 = 0;
                break;
            case IC_IL_DCP_IND_X:
            case IC_IL_DCP_IND_Y: 
                _CPU_DCP(state); 
                return state;

            case IC_IL_ISB_IND_X:
            case IC_IL_ISB_IND_Y: 
                _CPU_ISB(state); 
                return state;

            case IC_IL_SLO_IND_X:
            case IC_IL_SLO_IND_Y: 
                _CPU_SLO(state); 
                return state;

            case IC_IL_RLA_IND_X:
            case IC_IL_RLA_IND_Y: 
                _CPU_RLA(state); 
                return state;

            case IC_IL_SRE_IND_X:
            case IC_IL_SRE_IND_Y: 
                _CPU_SRE(state); 
                return state;

            case IC_IL_RRA_IND_X:
            case IC_IL_RRA_IND_Y: 
                _CPU_RRA(state); 
                return state;
        }
    }

    if (nmi_phase1 || irq_phase1)
    {
        state.rw_mode = CPU_RW_MODE_NONE;
        state.data = 0;
        state.cycle = 0;
        state.temp = 0xFE;
    }
    else
    {
        state.rw_mode = CPU_RW_MODE_READ;
        state.address = state.PC++;
        state.cycle = 0;
        state.temp = 0;
    }

    return state;
}